

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_json_read_dbpointer(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  char *****__haystack;
  long lVar6;
  char *pcVar7;
  undefined8 uVar8;
  char *__needle;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  undefined1 *__n;
  undefined1 *__s1;
  undefined1 *puVar12;
  void *__s2;
  undefined1 *puVar13;
  int *piVar14;
  double *pdVar15;
  long *plVar16;
  undefined8 extraout_RAX;
  undefined8 uVar17;
  undefined8 uVar18;
  ulong uVar19;
  int *piVar20;
  char *pcVar21;
  char *pcVar22;
  ulong uVar23;
  ulong uVar24;
  char *unaff_R12;
  undefined **ppuVar25;
  char *pcVar26;
  undefined **ppuVar27;
  long lVar28;
  char *****pppppcVar29;
  char *****pppppcVar30;
  int *piVar31;
  double dVar32;
  int extraout_XMM0_Db;
  bson_t b;
  bson_error_t error;
  code **ppcVar33;
  undefined4 uStack_635c;
  undefined8 uStack_6358;
  undefined2 uStack_6350;
  int iStack_6348;
  int iStack_6344;
  char acStack_6340 [504];
  code *pcStack_6148;
  undefined1 auStack_6138 [512];
  char *pcStack_5f38;
  code *pcStack_5f30;
  int iStack_5f20;
  int iStack_5f1c;
  char acStack_5f18 [504];
  long *plStack_5d20;
  double *pdStack_5d18;
  char *pcStack_5d10;
  code *pcStack_5d08;
  long lStack_5c90;
  long lStack_5c88;
  undefined1 auStack_5c80 [128];
  undefined1 auStack_5c00 [232];
  undefined1 auStack_5b18 [608];
  long *plStack_58b8;
  code *pcStack_58b0;
  undefined1 auStack_58a8 [8];
  char acStack_58a0 [16];
  char *pcStack_5890;
  code *pcStack_5888;
  uint uStack_5804;
  undefined8 uStack_5800;
  undefined8 uStack_57f8;
  undefined8 uStack_57f0;
  undefined8 uStack_57e8;
  undefined8 uStack_57e0;
  undefined8 uStack_57d8;
  undefined8 uStack_57d0;
  undefined8 uStack_57c8;
  undefined8 uStack_57c0;
  undefined8 uStack_57b8;
  undefined8 uStack_57b0;
  undefined8 uStack_57a8;
  undefined8 uStack_57a0;
  undefined8 uStack_5798;
  undefined8 uStack_5790;
  undefined8 uStack_5788;
  undefined1 auStack_5738 [648];
  int *piStack_54b0;
  double *pdStack_54a8;
  undefined **ppuStack_54a0;
  int *piStack_5498;
  int *piStack_5490;
  code *pcStack_5488;
  undefined1 auStack_5480 [240];
  undefined1 auStack_5390 [648];
  code *apcStack_5108 [16];
  double dStack_5088;
  int aiStack_5080 [50];
  int iStack_4fb8;
  int iStack_4fb4;
  int aiStack_4fb0 [160];
  int *piStack_4d30;
  double *pdStack_4d28;
  undefined **ppuStack_4d20;
  int *piStack_4d18;
  int *piStack_4d10;
  code *apcStack_4d08 [16];
  double dStack_4c88;
  int aiStack_4c80 [50];
  int iStack_4bb8;
  int iStack_4bb4;
  int aiStack_4bb0 [160];
  undefined8 uStack_4930;
  undefined1 *puStack_4928;
  char *pcStack_4920;
  char *pcStack_4918;
  undefined **ppuStack_4910;
  code *pcStack_4908;
  int iStack_4900;
  int iStack_48fc;
  char acStack_48f8 [504];
  undefined1 auStack_4700 [336];
  char *pcStack_45b0;
  undefined1 *puStack_45a8;
  undefined1 *puStack_45a0;
  void *pvStack_4598;
  void *pvStack_4590;
  code *pcStack_4588;
  undefined1 auStack_4580 [128];
  char acStack_4500 [232];
  undefined1 auStack_4418 [648];
  char *pcStack_4190;
  code *pcStack_4188;
  undefined1 auStack_4180 [128];
  char acStack_4100 [224];
  int iStack_4020;
  int iStack_401c;
  char acStack_4018 [640];
  char *pcStack_3d98;
  void *pvStack_3d90;
  code *pcStack_3d88;
  undefined1 auStack_3d80 [128];
  char acStack_3d00 [232];
  undefined1 auStack_3c18 [648];
  char *pcStack_3990;
  code *pcStack_3988;
  undefined1 auStack_3980 [232];
  int iStack_3898;
  int iStack_3894;
  char acStack_3890 [640];
  char *pcStack_3610;
  code *apcStack_3608 [16];
  uint uStack_3584;
  undefined1 auStack_3580 [4];
  uint uStack_357c;
  undefined1 auStack_34b8 [648];
  undefined1 *puStack_3230;
  undefined1 *puStack_3228;
  undefined1 *puStack_3220;
  void *pvStack_3218;
  void *pvStack_3210;
  code *apcStack_3208 [2];
  void *pvStack_31f8;
  char *pcStack_31f0;
  void *pvStack_31e8;
  char *pcStack_31e0;
  void *pvStack_31d8;
  char *pcStack_31d0;
  undefined1 *puStack_31c8;
  char *pcStack_31c0;
  undefined1 *puStack_31b8;
  char *pcStack_31b0;
  undefined8 uStack_31a8;
  char *pcStack_31a0;
  undefined8 uStack_3198;
  char *pcStack_3190;
  undefined8 uStack_3188;
  undefined1 auStack_3180 [4];
  uint uStack_317c;
  undefined1 auStack_30b8 [592];
  undefined8 uStack_2e68;
  char *pcStack_2e60;
  char *pcStack_2e58;
  char *pcStack_2e50;
  char *pcStack_2e48;
  char *pcStack_2e40;
  char *pcStack_2e38;
  char *pcStack_2e30;
  char *pcStack_2e28;
  char *pcStack_2e20;
  char *pcStack_2e18;
  char *pcStack_2e10;
  code *apcStack_2e08 [7];
  void *pvStack_2dd0;
  undefined8 uStack_2dc8;
  char *pcStack_2dc0;
  void *pvStack_2db8;
  char *pcStack_2db0;
  undefined8 uStack_2da8;
  char *pcStack_2da0;
  void *pvStack_2d98;
  char *pcStack_2d90;
  undefined8 uStack_2d88;
  char acStack_2d80 [4];
  uint uStack_2d7c;
  undefined1 auStack_2cb8 [648];
  undefined **ppuStack_2a30;
  char *pcStack_2a28;
  long lStack_2a20;
  undefined1 *puStack_2a18;
  undefined1 *puStack_2a10;
  code *pcStack_2a08;
  int iStack_2a00;
  int iStack_29fc;
  char acStack_29f8 [504];
  undefined1 auStack_2800 [168];
  undefined8 uStack_2758;
  long lStack_2750;
  undefined8 uStack_2748;
  undefined8 uStack_2740;
  char *pcStack_2738;
  char *pcStack_2730;
  char *pcStack_2728;
  char *pcStack_2720;
  char *pcStack_2718;
  long lStack_2710;
  undefined8 uStack_2708;
  char *pcStack_2700;
  char *pcStack_26f8;
  char *pcStack_26f0;
  char *pcStack_26e8;
  long lStack_26e0;
  char *pcStack_26d8;
  char *pcStack_26d0;
  char *pcStack_26c8;
  char *pcStack_26c0;
  char *pcStack_26b8;
  char *pcStack_26b0;
  char *pcStack_26a8;
  char *pcStack_26a0;
  char *pcStack_2698;
  char *pcStack_2690;
  code *apcStack_2688 [12];
  char *pcStack_2628;
  undefined8 uStack_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 uStack_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 uStack_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 uStack_25c0;
  undefined8 uStack_25b8;
  char *apcStack_25b0 [22];
  char acStack_2500 [4];
  uint uStack_24fc;
  undefined1 auStack_2438 [648];
  char *pcStack_21b0;
  undefined **ppuStack_21a8;
  int **ppiStack_21a0;
  char *pcStack_2198;
  int *piStack_2190;
  code *pcStack_2188;
  undefined1 auStack_2180 [128];
  undefined1 auStack_2100 [240];
  undefined1 auStack_2010 [648];
  code *pcStack_1d88;
  undefined1 auStack_1d80 [128];
  char acStack_1d00 [232];
  int iStack_1c18;
  int iStack_1c14;
  char acStack_1c10 [632];
  char *pcStack_1998;
  code *apcStack_1990 [2];
  int iStack_1980;
  int iStack_197c;
  undefined8 uStack_17a8;
  char *pcStack_17a0;
  undefined8 uStack_1798;
  int *piStack_1790;
  code *pcStack_1788;
  int iStack_1704;
  int aiStack_1700 [46];
  undefined8 uStack_1648;
  int *piStack_1640;
  char acStack_1634 [12];
  undefined1 auStack_1628 [648];
  char *pcStack_13a0;
  char *pcStack_1398;
  int *piStack_1390;
  code *apcStack_1388 [15];
  int iStack_1310;
  int iStack_130c;
  int *piStack_1308;
  char acStack_1300 [200];
  undefined1 auStack_1238 [648];
  char ****ppppcStack_fb0;
  char *pcStack_fa8;
  undefined **ppuStack_fa0;
  char ****ppppcStack_f98;
  int *piStack_f90;
  code *apcStack_f88 [14];
  int iStack_f14;
  char ****ppppcStack_f10;
  int iStack_f04;
  char ***apppcStack_f00 [26];
  int iStack_e30;
  int iStack_e2c;
  char ***apppcStack_e28 [80];
  char ****ppppcStack_ba8;
  char *pcStack_ba0;
  char ****ppppcStack_b98;
  int *piStack_b90;
  code *pcStack_b88;
  undefined8 uStack_b80;
  char ****ppppcStack_b10;
  undefined1 auStack_b08 [8];
  char ***apppcStack_b00 [28];
  undefined1 auStack_a20 [648];
  char ****ppppcStack_798;
  undefined1 *puStack_790;
  code *pcStack_788;
  undefined8 uStack_780;
  char ****ppppcStack_710;
  char ****ppppcStack_708;
  char ***apppcStack_700 [29];
  int iStack_618;
  int iStack_614;
  char ***apppcStack_610 [80];
  char ****ppppcStack_390;
  code *pcStack_388;
  char ***apppcStack_380 [25];
  int local_2b8;
  int local_2b4;
  char ***local_2b0 [80];
  
  pppppcVar30 = (char *****)apppcStack_380;
  pcVar21 = "{\"p\": {\"$dbPointer\": {\"$ref\": \"db.collection\"}}";
  ppuVar27 = &PTR_anon_var_dwarf_1a6a9_00161210;
  __haystack = (char *****)local_2b0;
  piVar20 = &local_2b8;
  do {
    pcStack_388 = (code *)0x12fef0;
    cVar1 = bson_init_from_json(apppcStack_380,pcVar21,0xffffffffffffffff,piVar20);
    if (cVar1 != '\0') {
      pcStack_388 = (code *)0x12ff49;
      test_bson_json_read_dbpointer_cold_3();
LAB_0012ff49:
      pcStack_388 = (code *)0x12ff4e;
      test_bson_json_read_dbpointer_cold_2();
LAB_0012ff4e:
      pcStack_388 = (code *)0x12ff6c;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",__haystack,
              unaff_R12);
      pcStack_388 = (code *)0x12ff71;
      abort();
    }
    if (local_2b8 != 1) {
      pcStack_388 = test_bson_json_read_legacy_regex;
      test_bson_json_read_dbpointer_cold_1();
      pcStack_788 = (code *)0x12ffa9;
      ppppcStack_390 = (char ****)__haystack;
      pcStack_388 = (code *)&stack0xfffffffffffffff8;
      cVar1 = bson_init_from_json(apppcStack_700,
                                  "{\"a\": {\"$regex\": \"abc\", \"$options\": \"ix\"}}",
                                  0xffffffffffffffff,&iStack_618);
      if (cVar1 == '\0') {
LAB_0013010d:
        pcStack_788 = (code *)0x13011a;
        test_bson_json_read_legacy_regex_cold_1();
LAB_0013011a:
        pcStack_788 = (code *)0x13011f;
        test_bson_json_read_legacy_regex_cold_4();
LAB_0013011f:
        pcStack_788 = (code *)0x130124;
        test_bson_json_read_legacy_regex_cold_5();
LAB_00130124:
        pcStack_788 = (code *)0x13012c;
        test_bson_json_read_legacy_regex_cold_10();
LAB_0013012c:
        pcStack_788 = (code *)0x130131;
        test_bson_json_read_legacy_regex_cold_6();
LAB_00130131:
        pcStack_788 = (code *)0x130136;
        test_bson_json_read_legacy_regex_cold_7();
LAB_00130136:
        pcStack_788 = (code *)0x13013e;
        test_bson_json_read_legacy_regex_cold_8();
LAB_0013013e:
        pcStack_788 = (code *)0x130146;
        test_bson_json_read_legacy_regex_cold_2();
      }
      else {
        pcStack_788 = (code *)0x12ffb6;
        uVar5 = bson_bcone_magic();
        uStack_780 = 0;
        pcStack_788 = (code *)0x12ffe9;
        bcon_extract(apppcStack_700,"a",uVar5,10,&ppppcStack_708,&ppppcStack_710);
        if ((char *****)ppppcStack_708 != (char *****)0x141ad0) {
          pcStack_788 = (code *)0x130007;
          iVar2 = strcmp((char *)ppppcStack_708,"abc");
          __haystack = (char *****)ppppcStack_708;
          if (iVar2 == 0) goto LAB_0013000f;
          goto LAB_0013013e;
        }
LAB_0013000f:
        if (ppppcStack_710 == (char ****)"ix") {
LAB_00130037:
          __haystack = (char *****)apppcStack_700;
          pcStack_788 = (code *)0x130047;
          bson_destroy(__haystack);
          pcStack_788 = (code *)0x130065;
          cVar1 = bson_init_from_json(__haystack,"{\"a\": {\"$regex\": \"abc\"}}",0xffffffffffffffff
                                      ,&iStack_618);
          if (cVar1 != '\0') {
            pcStack_788 = (code *)0x130108;
            test_bson_json_read_legacy_regex_cold_11();
LAB_00130108:
            pcStack_788 = (code *)0x13010d;
            test_bson_json_read_legacy_regex_cold_9();
            goto LAB_0013010d;
          }
          if (iStack_618 != 1) goto LAB_0013011a;
          if (iStack_614 != 2) goto LAB_0013011f;
          __haystack = (char *****)apppcStack_610;
          pcStack_788 = (code *)0x1300a4;
          pcVar21 = strstr((char *)__haystack,"Missing \"$options\" after \"$regex\"");
          if (pcVar21 == (char *)0x0) goto LAB_00130124;
          pcStack_788 = (code *)0x1300cc;
          cVar1 = bson_init_from_json(apppcStack_700,"{\"a\": {\"$options\": \"ix\"}}",
                                      0xffffffffffffffff,&iStack_618);
          if (cVar1 != '\0') goto LAB_00130108;
          if (iStack_618 != 1) goto LAB_0013012c;
          if (iStack_614 != 2) goto LAB_00130131;
          pcStack_788 = (code *)0x1300f7;
          pcVar21 = strstr((char *)__haystack,"Missing \"$regex\" after \"$options\"");
          if (pcVar21 != (char *)0x0) {
            return;
          }
          goto LAB_00130136;
        }
        pcStack_788 = (code *)0x13002f;
        iVar2 = strcmp((char *)ppppcStack_710,"ix");
        __haystack = (char *****)ppppcStack_710;
        if (iVar2 == 0) goto LAB_00130037;
      }
      pcStack_788 = test_bson_json_read_regex_options_order;
      test_bson_json_read_legacy_regex_cold_3();
      pcStack_b88 = (code *)0x130183;
      ppppcStack_798 = (char ****)__haystack;
      puStack_790 = (undefined1 *)apppcStack_380;
      pcStack_788 = (code *)&pcStack_388;
      cVar1 = bson_init_from_json(apppcStack_b00,
                                  "{\"a\": {\"$regex\": \"\", \"$options\": \"ism\"}}",
                                  0xffffffffffffffff,auStack_a20);
      if (cVar1 == '\0') {
        pcStack_b88 = (code *)0x130296;
        test_bson_json_read_regex_options_order_cold_1();
LAB_00130296:
        pcStack_b88 = (code *)0x1302a3;
        test_bson_json_read_regex_options_order_cold_3();
LAB_001302a3:
        pcStack_b88 = (code *)0x1302ab;
        test_bson_json_read_regex_options_order_cold_2();
      }
      else {
        pcStack_b88 = (code *)0x130190;
        __haystack = (char *****)bson_bcone_magic();
        uStack_b80 = 0;
        pcStack_b88 = (code *)0x1301c6;
        bcon_extract(apppcStack_b00,"a",__haystack,10,auStack_b08,&ppppcStack_b10);
        pppppcVar30 = (char *****)ppppcStack_b10;
        if (ppppcStack_b10 != (char ****)"ims") {
          pcStack_b88 = (code *)0x1301e4;
          iVar2 = strcmp((char *)ppppcStack_b10,"ims");
          if (iVar2 == 0) goto LAB_001301ec;
          goto LAB_001302a3;
        }
LAB_001301ec:
        pppppcVar30 = (char *****)apppcStack_b00;
        pcStack_b88 = (code *)0x1301fc;
        bson_destroy(pppppcVar30);
        pcStack_b88 = (code *)0x13021a;
        cVar1 = bson_init_from_json(pppppcVar30,
                                    "{\"a\": {\"$regex\": \"\", \"$options\": \"misl\"}}",
                                    0xffffffffffffffff,auStack_a20);
        if (cVar1 == '\0') goto LAB_00130296;
        uStack_b80 = 0;
        pppppcVar30 = &ppppcStack_b10;
        pcStack_b88 = (code *)0x130251;
        bcon_extract(apppcStack_b00,"a",__haystack,10,auStack_b08,pppppcVar30);
        if (ppppcStack_b10 == (char ****)"ilms") {
LAB_00130273:
          pcStack_b88 = (code *)0x130280;
          bson_destroy(apppcStack_b00);
          return;
        }
        pcStack_b88 = (code *)0x13026f;
        iVar2 = strcmp((char *)ppppcStack_b10,"ilms");
        __haystack = (char *****)ppppcStack_b10;
        if (iVar2 == 0) goto LAB_00130273;
      }
      pcStack_b88 = test_bson_json_read_binary;
      test_bson_json_read_regex_options_order_cold_4();
      apcStack_f88[0] = (code *)0x1302ec;
      ppppcStack_ba8 = (char ****)__haystack;
      pcStack_ba0 = unaff_R12;
      ppppcStack_b98 = (char ****)pppppcVar30;
      piStack_b90 = piVar20;
      pcStack_b88 = (code *)&pcStack_788;
      cVar1 = bson_init_from_json(apppcStack_f00,
                                  "{\"b\": {\"$binary\": {\"base64\": \"Zm9v\", \"subType\": \"05\"}}}"
                                  ,0xffffffffffffffff,&iStack_e30);
      if (cVar1 == '\0') {
LAB_001304f8:
        apcStack_f88[0] = (code *)0x130505;
        test_bson_json_read_binary_cold_1();
        pppppcVar29 = pppppcVar30;
LAB_00130505:
        apcStack_f88[0] = (code *)0x13050a;
        test_bson_json_read_binary_cold_2();
LAB_0013050a:
        pppppcVar30 = pppppcVar29;
        apcStack_f88[0] = (code *)0x13050f;
        test_bson_json_read_binary_cold_3();
LAB_0013050f:
        apcStack_f88[0] = (code *)0x13051c;
        test_bson_json_read_binary_cold_5();
LAB_0013051c:
        apcStack_f88[0] = (code *)0x130521;
        test_bson_json_read_binary_cold_6();
LAB_00130521:
        apcStack_f88[0] = (code *)0x130526;
        test_bson_json_read_binary_cold_7();
LAB_00130526:
        apcStack_f88[0] = (code *)0x13052b;
        test_bson_json_read_binary_cold_9();
LAB_0013052b:
        apcStack_f88[0] = (code *)0x130530;
        test_bson_json_read_binary_cold_10();
LAB_00130530:
        apcStack_f88[0] = (code *)0x130538;
        test_bson_json_read_binary_cold_15();
LAB_00130538:
        apcStack_f88[0] = (code *)0x13053d;
        test_bson_json_read_binary_cold_11();
LAB_0013053d:
        apcStack_f88[0] = (code *)0x130542;
        test_bson_json_read_binary_cold_12();
LAB_00130542:
        apcStack_f88[0] = (code *)0x13054a;
        test_bson_json_read_binary_cold_13();
LAB_0013054a:
        apcStack_f88[0] = (code *)0x130552;
        test_bson_json_read_binary_cold_4();
      }
      else {
        apcStack_f88[0] = (code *)0x1302f9;
        __haystack = (char *****)bson_bcone_magic();
        piVar20 = &iStack_f14;
        apcStack_f88[0] = (code *)0x0;
        ppppcStack_f98 = (char ****)0x130330;
        piStack_f90 = piVar20;
        bcon_extract(apppcStack_f00,"b",__haystack,4,&iStack_f04,&ppppcStack_f10);
        pppppcVar30 = (char *****)ppppcStack_f10;
        pppppcVar29 = (char *****)&iStack_f04;
        if (iStack_f04 != 5) goto LAB_00130505;
        if (iStack_f14 != 3) goto LAB_0013050a;
        unaff_R12 = "foo";
        if (ppppcStack_f10 != (char ****)"foo") {
          apcStack_f88[0] = (code *)0x13036d;
          iVar2 = strcmp((char *)ppppcStack_f10,"foo");
          if (iVar2 == 0) goto LAB_00130375;
          goto LAB_0013054a;
        }
LAB_00130375:
        pppppcVar30 = (char *****)apppcStack_f00;
        apcStack_f88[0] = (code *)0x130385;
        bson_destroy(pppppcVar30);
        apcStack_f88[0] = (code *)0x1303a3;
        cVar1 = bson_init_from_json(pppppcVar30,
                                    "{\"b\": {\"$binary\": {\"subType\": \"05\", \"base64\": \"Zm9v\"}}}"
                                    ,0xffffffffffffffff,&iStack_e30);
        if (cVar1 == '\0') goto LAB_0013050f;
        pppppcVar30 = (char *****)&iStack_f04;
        apcStack_f88[0] = (code *)0x0;
        ppppcStack_f98 = (char ****)0x1303da;
        piStack_f90 = piVar20;
        bcon_extract(apppcStack_f00,"b",__haystack,4,pppppcVar30,&ppppcStack_f10);
        if (iStack_f04 != 5) goto LAB_0013051c;
        if (iStack_f14 != 3) goto LAB_00130521;
        if (ppppcStack_f10 == (char ****)"foo") {
LAB_00130418:
          __haystack = (char *****)apppcStack_f00;
          apcStack_f88[0] = (code *)0x130428;
          bson_destroy(__haystack);
          apcStack_f88[0] = (code *)0x130446;
          cVar1 = bson_init_from_json(__haystack,"{\"b\": {\"$binary\": {\"subType\": \"5\"}}}",
                                      0xffffffffffffffff,&iStack_e30);
          if (cVar1 != '\0') {
            apcStack_f88[0] = (code *)0x1304f3;
            test_bson_json_read_binary_cold_16();
LAB_001304f3:
            apcStack_f88[0] = (code *)0x1304f8;
            test_bson_json_read_binary_cold_14();
            goto LAB_001304f8;
          }
          if (iStack_e30 != 1) goto LAB_00130526;
          if (iStack_e2c != 2) goto LAB_0013052b;
          __haystack = (char *****)apppcStack_e28;
          apcStack_f88[0] = (code *)0x130485;
          pcVar21 = strstr((char *)__haystack,"Missing \"base64\" after \"subType\"");
          if (pcVar21 == (char *)0x0) goto LAB_00130530;
          apcStack_f88[0] = (code *)0x1304b1;
          cVar1 = bson_init_from_json(apppcStack_f00,
                                      "{\"b\": {\"$binary\": {\"base64\": \"Zm9v\"}}}",
                                      0xffffffffffffffff,&iStack_e30);
          if (cVar1 != '\0') goto LAB_001304f3;
          if (iStack_e30 != 1) goto LAB_00130538;
          if (iStack_e2c != 2) goto LAB_0013053d;
          apcStack_f88[0] = (code *)0x1304dc;
          pcVar21 = strstr((char *)__haystack,"Missing \"subType\" after \"base64\"");
          if (pcVar21 != (char *)0x0) {
            return;
          }
          goto LAB_00130542;
        }
        apcStack_f88[0] = (code *)0x130410;
        iVar2 = strcmp((char *)ppppcStack_f10,"foo");
        __haystack = (char *****)ppppcStack_f10;
        if (iVar2 == 0) goto LAB_00130418;
      }
      apcStack_f88[0] = test_bson_json_read_legacy_binary;
      test_bson_json_read_binary_cold_8();
      pcVar22 = "{\"x\": {\"$binary\": \"Zm9v\", \"$type\": \"05\"}}";
      ppuVar25 = &PTR_anon_var_dwarf_1a81d_00161258;
      pcVar21 = "foo";
      ppppcStack_fb0 = (char ****)__haystack;
      pcStack_fa8 = unaff_R12;
      ppuStack_fa0 = ppuVar27;
      ppppcStack_f98 = (char ****)pppppcVar30;
      piStack_f90 = piVar20;
      apcStack_f88[0] = (code *)&pcStack_b88;
      break;
    }
    if (local_2b4 != 2) goto LAB_0012ff49;
    unaff_R12 = ppuVar27[-1];
    pcStack_388 = (code *)0x12ff1b;
    pcVar21 = strstr((char *)__haystack,unaff_R12);
    if (pcVar21 == (char *)0x0) goto LAB_0012ff4e;
    pcStack_388 = (code *)0x12ff28;
    bson_destroy(apppcStack_380);
    pcVar21 = *ppuVar27;
    ppuVar27 = ppuVar27 + 2;
    if (pcVar21 == (char *)0x0) {
      return;
    }
  } while( true );
LAB_00130594:
  apcStack_1388[0] = (code *)0x1305ab;
  cVar1 = bson_init_from_json(acStack_1300,pcVar22,0xffffffffffffffff,auStack_1238);
  if (cVar1 == '\0') {
LAB_00130643:
    apcStack_1388[0] = (code *)0x130650;
    test_bson_json_read_legacy_binary_cold_1();
LAB_00130650:
    apcStack_1388[0] = test_json_reader_new_from_file;
    test_bson_json_read_legacy_binary_cold_4();
    pcStack_1398 = "foo";
    aiStack_1700[0x1c] = 0;
    aiStack_1700[0x1d] = 0;
    aiStack_1700[0x1e] = 0;
    aiStack_1700[0x1f] = 0;
    aiStack_1700[0x18] = 0;
    aiStack_1700[0x19] = 0;
    aiStack_1700[0x1a] = 0;
    aiStack_1700[0x1b] = 0;
    aiStack_1700[0x14] = 0;
    aiStack_1700[0x15] = 0;
    aiStack_1700[0x16] = 0;
    aiStack_1700[0x17] = 0;
    aiStack_1700[0x10] = 0;
    aiStack_1700[0x11] = 0;
    aiStack_1700[0x12] = 0;
    aiStack_1700[0x13] = 0;
    aiStack_1700[0xc] = 0;
    aiStack_1700[0xd] = 0;
    aiStack_1700[0xe] = 0;
    aiStack_1700[0xf] = 0;
    aiStack_1700[8] = 0;
    aiStack_1700[9] = 0;
    aiStack_1700[10] = 0;
    aiStack_1700[0xb] = 0;
    aiStack_1700[4] = 0;
    aiStack_1700[5] = 0;
    aiStack_1700[6] = 0;
    aiStack_1700[7] = 0;
    aiStack_1700[0] = 3;
    aiStack_1700[1] = 5;
    aiStack_1700[2] = 5;
    aiStack_1700[3] = 0;
    pcStack_1788 = (code *)0x1306dd;
    pcStack_13a0 = acStack_1300;
    piStack_1390 = piVar20;
    apcStack_1388[0] = (code *)apcStack_f88;
    pcVar22 = (char *)bson_json_reader_new_from_file
                                ("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/json/test.json"
                                 ,auStack_1628);
    if (pcVar22 == (char *)0x0) {
      pcStack_1788 = (code *)0x130826;
      test_json_reader_new_from_file_cold_6();
      pcVar22 = acStack_1300;
LAB_00130826:
      pcStack_1788 = (code *)0x13082b;
      test_json_reader_new_from_file_cold_5();
LAB_0013082b:
      pcStack_1788 = (code *)0x130843;
      test_json_reader_new_from_file_cold_1();
LAB_00130843:
      pcStack_1788 = (code *)0x130848;
      test_json_reader_new_from_file_cold_3();
LAB_00130848:
      pcStack_1788 = (code *)0x130860;
      test_json_reader_new_from_file_cold_4();
    }
    else {
      pcStack_1788 = (code *)0x130701;
      iVar2 = bson_json_reader_read(pcVar22,aiStack_1700,auStack_1628);
      if (iVar2 != 1) goto LAB_0013082b;
      pcStack_1788 = (code *)0x13070f;
      pcVar21 = (char *)bson_bcone_magic();
      piStack_1790 = &iStack_1704;
      pcStack_1788 = (code *)0x0;
      uStack_1798 = 0xf;
      uStack_17a8 = 0x13074c;
      pcStack_17a0 = pcVar21;
      bcon_extract(aiStack_1700,"foo",pcVar21,0,&piStack_1640,"a");
      piVar20 = piStack_1640;
      if (piStack_1640 == (int *)0x1408f8) {
LAB_00130776:
        if (iStack_1704 != 1) goto LAB_00130843;
        piVar20 = aiStack_1700;
        pcStack_1788 = (code *)0x130793;
        bson_reinit(piVar20);
        pcStack_1788 = (code *)0x1307a6;
        iVar2 = bson_json_reader_read(pcVar22,piVar20,auStack_1628);
        if (iVar2 == 1) {
          piVar20 = (int *)&uStack_1648;
          pcStack_1788 = (code *)0x1307db;
          bcon_extract(aiStack_1700,"_id",pcVar21,6,piVar20,0);
          pcVar21 = acStack_1634;
          pcStack_1788 = (code *)0x1307f2;
          bson_oid_init_from_string(pcVar21,"aabbccddeeff001122334455");
          pcStack_1788 = (code *)0x1307fd;
          cVar1 = bson_oid_equal(pcVar21,uStack_1648);
          if (cVar1 != '\0') {
            pcStack_1788 = (code *)0x13080e;
            bson_destroy(aiStack_1700);
            pcStack_1788 = (code *)0x130816;
            bson_json_reader_destroy(pcVar22);
            return;
          }
          goto LAB_00130826;
        }
        goto LAB_00130848;
      }
      pcStack_1788 = (code *)0x13076e;
      iVar2 = strcmp("bar",(char *)piStack_1640);
      if (iVar2 == 0) goto LAB_00130776;
    }
    pcStack_1788 = test_json_reader_new_from_bad_path;
    test_json_reader_new_from_file_cold_2();
    apcStack_1990[0] = (code *)0x130880;
    lVar6 = bson_json_reader_new_from_file
                      ("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/json/does-not-exist"
                       ,&iStack_1980);
    if (lVar6 == 0) {
      if (iStack_1980 != 2) goto LAB_001308a4;
      if (iStack_197c == 1) {
        return;
      }
    }
    else {
      apcStack_1990[0] = (code *)0x1308a4;
      test_json_reader_new_from_bad_path_cold_1();
LAB_001308a4:
      apcStack_1990[0] = (code *)0x1308a9;
      test_json_reader_new_from_bad_path_cold_2();
    }
    apcStack_1990[0] = test_bson_json_number_long;
    test_json_reader_new_from_bad_path_cold_3();
    pcStack_1d88 = (code *)0x1308e1;
    pcStack_1998 = pcVar22;
    apcStack_1990[0] = (code *)apcStack_1388;
    cVar1 = bson_init_from_json(acStack_1d00,"{\"key\": {\"$numberLong\": \"4611686018427387904\"}}"
                                ,0xffffffffffffffff,&iStack_1c18);
    if (cVar1 == '\0') {
LAB_00130c76:
      pcStack_1d88 = (code *)0x130c83;
      test_bson_json_number_long_cold_1();
LAB_00130c83:
      pcStack_1d88 = (code *)0x130c90;
      test_bson_json_number_long_cold_6();
LAB_00130c90:
      pcStack_1d88 = (code *)0x130c98;
      test_bson_json_number_long_cold_9();
LAB_00130c98:
      pcStack_1d88 = (code *)0x130ca5;
      test_bson_json_number_long_cold_10();
LAB_00130ca5:
      pcStack_1d88 = (code *)0x130cad;
      test_bson_json_number_long_cold_13();
LAB_00130cad:
      pcStack_1d88 = (code *)0x130cb2;
      test_bson_json_number_long_cold_14();
LAB_00130cb2:
      pcStack_1d88 = (code *)0x130cb7;
      test_bson_json_number_long_cold_15();
LAB_00130cb7:
      pcStack_1d88 = (code *)0x130cbf;
      test_bson_json_number_long_cold_28();
LAB_00130cbf:
      pcStack_1d88 = (code *)0x130cc4;
      test_bson_json_number_long_cold_16();
LAB_00130cc4:
      pcStack_1d88 = (code *)0x130cc9;
      test_bson_json_number_long_cold_17();
LAB_00130cc9:
      pcStack_1d88 = (code *)0x130cd1;
      test_bson_json_number_long_cold_26();
LAB_00130cd1:
      pcStack_1d88 = (code *)0x130cd6;
      test_bson_json_number_long_cold_18();
LAB_00130cd6:
      pcStack_1d88 = (code *)0x130cdb;
      test_bson_json_number_long_cold_19();
LAB_00130cdb:
      pcStack_1d88 = (code *)0x130ce3;
      test_bson_json_number_long_cold_24();
LAB_00130ce3:
      pcStack_1d88 = (code *)0x130ce8;
      test_bson_json_number_long_cold_20();
LAB_00130ce8:
      pcStack_1d88 = (code *)0x130ced;
      test_bson_json_number_long_cold_21();
    }
    else {
      pcStack_1d88 = (code *)0x1308f9;
      cVar1 = bson_iter_init(auStack_1d80,acStack_1d00);
      if (cVar1 == '\0') {
        pcStack_1d88 = (code *)0x130c35;
        test_bson_json_number_long_cold_2();
LAB_00130c35:
        pcStack_1d88 = (code *)0x130c3a;
        test_bson_json_number_long_cold_3();
LAB_00130c3a:
        pcStack_1d88 = (code *)0x130c3f;
        test_bson_json_number_long_cold_4();
LAB_00130c3f:
        pcStack_1d88 = (code *)0x130c44;
        test_bson_json_number_long_cold_5();
LAB_00130c44:
        pcStack_1d88 = (code *)0x130c49;
        test_bson_json_number_long_cold_31();
LAB_00130c49:
        pcStack_1d88 = (code *)0x130c4e;
        test_bson_json_number_long_cold_30();
LAB_00130c4e:
        pcStack_1d88 = (code *)0x130c53;
        test_bson_json_number_long_cold_7();
LAB_00130c53:
        pcStack_1d88 = (code *)0x130c58;
        test_bson_json_number_long_cold_8();
LAB_00130c58:
        pcStack_1d88 = (code *)0x130c5d;
        test_bson_json_number_long_cold_11();
LAB_00130c5d:
        pcStack_1d88 = (code *)0x130c62;
        test_bson_json_number_long_cold_12();
LAB_00130c62:
        pcStack_1d88 = (code *)0x130c67;
        test_bson_json_number_long_cold_29();
LAB_00130c67:
        pcStack_1d88 = (code *)0x130c6c;
        test_bson_json_number_long_cold_27();
LAB_00130c6c:
        pcStack_1d88 = (code *)0x130c71;
        test_bson_json_number_long_cold_25();
LAB_00130c71:
        pcStack_1d88 = (code *)0x130c76;
        test_bson_json_number_long_cold_23();
        goto LAB_00130c76;
      }
      pcStack_1d88 = (code *)0x130910;
      cVar1 = bson_iter_find(auStack_1d80,"key");
      if (cVar1 == '\0') goto LAB_00130c35;
      pcStack_1d88 = (code *)0x130920;
      iVar2 = bson_iter_type(auStack_1d80);
      if (iVar2 != 0x12) goto LAB_00130c3a;
      pcStack_1d88 = (code *)0x130931;
      lVar6 = bson_iter_int64(auStack_1d80);
      if (lVar6 != 0x4000000000000000) goto LAB_00130c3f;
      pcVar22 = acStack_1d00;
      pcStack_1d88 = (code *)0x130954;
      bson_destroy(pcVar22);
      pcStack_1d88 = (code *)0x130972;
      cVar1 = bson_init_from_json(pcVar22,"{\"key\": {\"$numberLong\": \"461168601abcd\"}}",
                                  0xffffffffffffffff,&iStack_1c18);
      if (cVar1 != '\0') goto LAB_00130c44;
      pcStack_1d88 = (code *)0x13099d;
      cVar1 = bson_init_from_json(acStack_1d00,"{\"key\": {\"$numberLong\": \"461168601abcd\"}}",
                                  0xffffffffffffffff,&iStack_1c18);
      if (cVar1 != '\0') goto LAB_00130c49;
      pcStack_1d88 = (code *)0x1309c8;
      cVar1 = bson_init_from_json(acStack_1d00,"{\"x\": {\"$numberLong\": \"9223372036854775807\"}}"
                                  ,0xffffffffffffffff,&iStack_1c18);
      if (cVar1 == '\0') goto LAB_00130c83;
      pcStack_1d88 = (code *)0x1309e7;
      cVar1 = bson_iter_init_find(auStack_1d80,acStack_1d00,"x");
      if (cVar1 == '\0') goto LAB_00130c4e;
      pcStack_1d88 = (code *)0x1309f7;
      iVar2 = bson_iter_type(auStack_1d80);
      if (iVar2 != 0x12) goto LAB_00130c53;
      pcVar22 = (char *)0x7fffffffffffffff;
      pcStack_1d88 = (code *)0x130a12;
      lVar6 = bson_iter_int64(auStack_1d80);
      if (lVar6 != 0x7fffffffffffffff) goto LAB_00130c90;
      pcStack_1d88 = (code *)0x130a3e;
      cVar1 = bson_init_from_json(acStack_1d00,
                                  "{\"x\": {\"$numberLong\": \"-9223372036854775808\"}}",
                                  0xffffffffffffffff,&iStack_1c18);
      if (cVar1 == '\0') goto LAB_00130c98;
      pcStack_1d88 = (code *)0x130a5d;
      cVar1 = bson_iter_init_find(auStack_1d80,acStack_1d00,"x");
      if (cVar1 == '\0') goto LAB_00130c58;
      pcStack_1d88 = (code *)0x130a6d;
      iVar2 = bson_iter_type(auStack_1d80);
      if (iVar2 != 0x12) goto LAB_00130c5d;
      pcStack_1d88 = (code *)0x130a7e;
      lVar6 = bson_iter_int64(auStack_1d80);
      pcVar22 = (char *)0x8000000000000000;
      if (lVar6 != -0x8000000000000000) goto LAB_00130ca5;
      pcVar22 = acStack_1d00;
      pcStack_1d88 = (code *)0x130a9a;
      bson_destroy(pcVar22);
      pcStack_1d88 = (code *)0x130ab8;
      cVar1 = bson_init_from_json(pcVar22,"{\"x\": {\"$numberLong\": \"9223372036854775808\"}}",
                                  0xffffffffffffffff,&iStack_1c18);
      if (cVar1 != '\0') goto LAB_00130c62;
      if (iStack_1c18 != 1) goto LAB_00130cad;
      if (iStack_1c14 != 2) goto LAB_00130cb2;
      pcVar22 = acStack_1c10;
      pcStack_1d88 = (code *)0x130af7;
      pcVar7 = strstr(pcVar22,"Number \"9223372036854775808\" is out of range");
      if (pcVar7 == (char *)0x0) goto LAB_00130cb7;
      pcStack_1d88 = (code *)0x130b23;
      cVar1 = bson_init_from_json(acStack_1d00,
                                  "{\"x\": {\"$numberLong\": \"-9223372036854775809\"}}",
                                  0xffffffffffffffff,&iStack_1c18);
      if (cVar1 != '\0') goto LAB_00130c67;
      if (iStack_1c18 != 1) goto LAB_00130cbf;
      if (iStack_1c14 != 2) goto LAB_00130cc4;
      pcStack_1d88 = (code *)0x130b5a;
      pcVar7 = strstr(pcVar22,"Number \"-9223372036854775809\" is out of range");
      if (pcVar7 == (char *)0x0) goto LAB_00130cc9;
      pcStack_1d88 = (code *)0x130b86;
      cVar1 = bson_init_from_json(acStack_1d00,
                                  "{\"x\": {\"$numberLong\": \"10000000000000000000\"}}",
                                  0xffffffffffffffff,&iStack_1c18);
      if (cVar1 != '\0') goto LAB_00130c6c;
      if (iStack_1c18 != 1) goto LAB_00130cd1;
      if (iStack_1c14 != 2) goto LAB_00130cd6;
      pcStack_1d88 = (code *)0x130bbd;
      pcVar7 = strstr(pcVar22,"Number \"10000000000000000000\" is out of range");
      if (pcVar7 == (char *)0x0) goto LAB_00130cdb;
      pcStack_1d88 = (code *)0x130be9;
      cVar1 = bson_init_from_json(acStack_1d00,"{\"x\": -10000000000000000000}",0xffffffffffffffff,
                                  &iStack_1c18);
      if (cVar1 != '\0') goto LAB_00130c71;
      if (iStack_1c18 != 1) goto LAB_00130ce3;
      if (iStack_1c14 != 2) goto LAB_00130ce8;
      pcStack_1d88 = (code *)0x130c20;
      pcVar7 = strstr(pcVar22,"Number \"-10000000000000000000\" is out of range");
      if (pcVar7 != (char *)0x0) {
        return;
      }
    }
    pcStack_1d88 = test_bson_json_number_long_zero;
    test_bson_json_number_long_cold_22();
    pcStack_2188 = (code *)0x130d27;
    pcStack_1d88 = (code *)apcStack_1990;
    cVar1 = bson_init_from_json(auStack_2100,"{ \"key\": { \"$numberLong\": \"0\" }}",
                                0xffffffffffffffff,auStack_2010);
    if (cVar1 != '\0') {
      pcStack_2188 = (code *)0x130d3b;
      cVar1 = bson_iter_init(auStack_2180,auStack_2100);
      if (cVar1 == '\0') {
        pcStack_2188 = (code *)0x130d83;
        test_bson_json_number_long_zero_cold_2();
LAB_00130d83:
        pcStack_2188 = (code *)0x130d88;
        test_bson_json_number_long_zero_cold_3();
LAB_00130d88:
        pcStack_2188 = (code *)0x130d8d;
        test_bson_json_number_long_zero_cold_4();
      }
      else {
        pcStack_2188 = (code *)0x130d4e;
        cVar1 = bson_iter_find(auStack_2180,"key");
        if (cVar1 == '\0') goto LAB_00130d83;
        pcStack_2188 = (code *)0x130d5a;
        iVar2 = bson_iter_type(auStack_2180);
        if (iVar2 != 0x12) goto LAB_00130d88;
        pcStack_2188 = (code *)0x130d67;
        lVar6 = bson_iter_int64(auStack_2180);
        if (lVar6 == 0) {
          pcStack_2188 = (code *)0x130d79;
          bson_destroy(auStack_2100);
          return;
        }
      }
      pcStack_2188 = (code *)0x130d92;
      test_bson_json_number_long_zero_cold_5();
    }
    pcStack_2188 = test_bson_json_code;
    test_bson_json_number_long_zero_cold_1();
    apcStack_2688[0] = (code *)0x130dbc;
    pcStack_21b0 = pcVar22;
    ppuStack_21a8 = ppuVar25;
    ppiStack_21a0 = &piStack_1308;
    pcStack_2198 = pcVar21;
    piStack_2190 = piVar20;
    pcStack_2188 = (code *)&pcStack_1d88;
    lVar6 = bson_bcon_magic();
    apcStack_2688[0] = (code *)0x130de7;
    pcStack_2628 = (char *)bcon_new(0,"a",lVar6,0xc,"b",0);
    apcStack_2688[0] = (code *)0x130e0a;
    uStack_25b8 = bcon_new(0,"a",lVar6,0xc,"b",0);
    apcStack_2688[0] = (code *)0x130e33;
    uVar5 = bcon_new(0,"var",lVar6,0xf,1,0);
    pcStack_2690 = (char *)0x0;
    pcStack_2698 = (char *)0x130e59;
    uStack_25c0 = bcon_new(0,"a",lVar6,0xe,"b",uVar5);
    apcStack_2688[0] = (code *)0x130e86;
    uVar8 = bcon_new(0,"var2",lVar6,0x11,2,0);
    pcStack_2690 = (char *)0x0;
    pcStack_2698 = (char *)0x130eac;
    uStack_25c8 = bcon_new(0,"a",lVar6,0xe,"b",uVar8);
    apcStack_2688[0] = (code *)0x0;
    pcStack_2698 = "d";
    pcStack_26a0 = (char *)0xe;
    pcStack_26b0 = "c";
    pcStack_26b8 = (char *)0x130ef6;
    pcStack_26a8 = (char *)lVar6;
    pcStack_2690 = (char *)uVar8;
    uStack_2600 = uVar8;
    uStack_25d0 = bcon_new(0,"a",lVar6,0xe,"b",uVar5);
    pcStack_2690 = (char *)0x0;
    pcStack_2698 = "}";
    pcStack_26a0 = "}";
    pcStack_26a8 = "value2";
    pcStack_26b0 = (char *)0x0;
    pcStack_26c0 = "key2";
    pcStack_26c8 = "{";
    pcStack_26d0 = "subdoc";
    pcStack_26d8 = "value";
    lStack_26e0 = 0;
    pcStack_26f0 = "key1";
    pcStack_26f8 = "{";
    pcStack_2700 = "c";
    uStack_2708 = 0x130f7a;
    pcStack_26e8 = (char *)lVar6;
    pcStack_26b8 = (char *)lVar6;
    uStack_25d8 = bcon_new(0,"a",lVar6,0xe,"b",uVar5);
    pcStack_2690 = (char *)0x0;
    pcStack_2698 = (char *)0x130fbe;
    uStack_25f8 = uVar5;
    uStack_25e0 = bcon_new(0,"a",lVar6,0xe,"b",uVar5);
    apcStack_2688[0] = (code *)0x130fe7;
    uStack_2608 = bcon_new(0,"var","{","}",0);
    pcStack_2690 = (char *)0x0;
    pcStack_2698 = (char *)0x13100f;
    uStack_25e8 = bcon_new(0,"a",lVar6,0xe,"b",uStack_2608);
    apcStack_2688[0] = (code *)0x0;
    pcStack_2690 = "}";
    pcStack_2698 = "}";
    pcStack_26a0 = (char *)0x3;
    pcStack_26a8 = (char *)0xf;
    pcStack_26b8 = "z";
    pcStack_26c0 = "{";
    pcStack_26c8 = "d3";
    pcStack_26d0 = (char *)0x1;
    pcStack_26d8 = (char *)0xf;
    pcStack_26e8 = "x";
    pcStack_26f0 = "{";
    pcStack_26f8 = "d2";
    pcStack_2700 = (char *)0x1;
    uStack_2708 = 0x11;
    pcStack_2718 = "n";
    pcStack_2720 = "}";
    pcStack_2728 = "{";
    pcStack_2730 = "d";
    pcStack_2738 = "]";
    uStack_2740 = 2;
    uStack_2748 = 0xf;
    uStack_2758 = 0x1310bd;
    lStack_2750 = lVar6;
    lStack_2710 = lVar6;
    lStack_26e0 = lVar6;
    pcStack_26b0 = (char *)lVar6;
    uStack_2610 = bcon_new(0,"arr","[",lVar6,0xf,1);
    pcStack_2690 = (char *)0x0;
    pcStack_2698 = (char *)0x1310f6;
    uStack_25f0 = bcon_new(0,"a",lVar6,0xe,"b",uStack_2610);
    apcStack_2688[0] = (code *)0x131107;
    uStack_2618 = bson_new();
    pcStack_2690 = (char *)0x0;
    pcStack_2698 = (char *)0x13112f;
    pcVar22 = (char *)bcon_new(0,"a",lVar6,0xe,"b",uStack_2618);
    pcStack_2690 = (char *)0x0;
    pcStack_2698 = "}";
    pcStack_26a0 = "c";
    pcStack_26a8 = (char *)0x131172;
    uStack_2620 = bcon_new(0,"x","{","$code",lVar6,0);
    pcStack_2690 = (char *)0x0;
    pcStack_2698 = (char *)0x131197;
    apcStack_25b0[0x15] = (char *)bcon_new(0,"a",lVar6,0xe,"b",uStack_2620);
    apcStack_25b0[0] = "{\"a\": {\"$code\": \"b\"}}";
    apcStack_25b0[1] = pcStack_2628;
    apcStack_25b0[2] = "{\"a\": {\"$code\": \"b\\u0000c\\u0000\"}}";
    apcStack_25b0[3] = (char *)uStack_25b8;
    apcStack_25b0[4] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}}";
    apcStack_25b0[5] = (char *)uStack_25c0;
    apcStack_25b0[6] =
         "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}";
    apcStack_25b0[7] = (char *)uStack_25c8;
    apcStack_25b0[8] =
         "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"key1\": \"value\",          \"subdoc\": {\"key2\": \"value2\"}}}"
    ;
    apcStack_25b0[9] = (char *)uStack_25d8;
    apcStack_25b0[10] =
         "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"$code\": \"d\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}"
    ;
    apcStack_25b0[0xb] = (char *)uStack_25d0;
    apcStack_25b0[0xc] = "{\"a\": {\"$scope\": {\"var\": 1},          \"$code\": \"b\"}}";
    apcStack_25b0[0xd] = (char *)uStack_25e0;
    apcStack_25b0[0xe] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": {}}}}";
    apcStack_25b0[0xf] = (char *)uStack_25e8;
    apcStack_25b0[0x10] =
         "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"arr\": [1, 2], \"d\": {},                      \"n\": {\"$numberLong\": \"1\"},                      \"d2\": {\"x\": 1, \"d3\": {\"z\": 3}}}}}"
    ;
    apcStack_25b0[0x11] = (char *)uStack_25f0;
    apcStack_25b0[0x12] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {}}}";
    apcStack_25b0[0x13] = pcVar22;
    apcStack_25b0[0x14] =
         "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"x\": {\"$code\": \"c\"}}}}";
    pcVar26 = (char *)0x8;
    pcVar21 = acStack_2500;
    pcVar7 = "b";
    goto LAB_001312eb;
  }
  apcStack_1388[0] = (code *)0x1305b8;
  uVar5 = bson_bcone_magic();
  apcStack_1388[0] = (code *)0x0;
  piStack_1390 = &iStack_1310;
  pcStack_1398 = (char *)0x1305e2;
  bcon_extract(acStack_1300,"x",uVar5,4,&iStack_130c,&piStack_1308);
  if (iStack_130c != 5) {
LAB_0013063e:
    apcStack_1388[0] = (code *)0x130643;
    test_bson_json_read_legacy_binary_cold_2();
    goto LAB_00130643;
  }
  if (iStack_1310 != 3) {
    apcStack_1388[0] = (code *)0x13063e;
    test_bson_json_read_legacy_binary_cold_3();
    goto LAB_0013063e;
  }
  piVar20 = piStack_1308;
  if (piStack_1308 != (int *)"foo") {
    apcStack_1388[0] = (code *)0x13060d;
    iVar2 = strcmp((char *)piStack_1308,"foo");
    if (iVar2 == 0) goto LAB_00130611;
    goto LAB_00130650;
  }
LAB_00130611:
  apcStack_1388[0] = (code *)0x130619;
  bson_destroy(acStack_1300);
  pcVar22 = *ppuVar25;
  ppuVar25 = ppuVar25 + 1;
  if (pcVar22 == (char *)0x0) {
    return;
  }
  goto LAB_00130594;
LAB_001312eb:
  apcStack_2688[0] = (code *)0x13130a;
  cVar1 = bson_init_from_json(pcVar21,*(undefined8 *)((long)&uStack_25b8 + (long)pcVar26),
                              0xffffffffffffffff,auStack_2438);
  __needle = pcVar26;
  if (cVar1 == '\0') goto LAB_00131529;
  apcStack_2688[0] = (code *)0x13131d;
  pcStack_2628 = (char *)bson_get_data(pcVar21);
  lVar6 = *(long *)((long)apcStack_25b0 + (long)pcVar26);
  apcStack_2688[0] = (code *)0x131332;
  __needle = (char *)bson_get_data(lVar6);
  if (*(uint *)(lVar6 + 4) != uStack_24fc) {
LAB_001313fc:
    apcStack_2688[0] = (code *)0x13140e;
    pcVar21 = (char *)bson_as_canonical_extended_json(acStack_2500);
    apcStack_2688[0] = (code *)0x13141b;
    uVar5 = bson_as_canonical_extended_json(lVar6);
    pcVar22 = pcStack_2628;
    uVar19 = 0xffffffff;
    if (uStack_24fc == 0) goto LAB_00131463;
    uVar23 = 0;
    goto LAB_00131448;
  }
  apcStack_2688[0] = (code *)0x13134e;
  pvVar9 = (void *)bson_get_data(lVar6);
  apcStack_2688[0] = (code *)0x131359;
  pvVar10 = (void *)bson_get_data(pcVar21);
  apcStack_2688[0] = (code *)0x131368;
  iVar2 = bcmp(pvVar9,pvVar10,(ulong)*(uint *)(lVar6 + 4));
  if (iVar2 != 0) goto LAB_001313fc;
  apcStack_2688[0] = (code *)0x13137b;
  bson_destroy(pcVar21);
  pcVar26 = pcVar26 + 0x10;
  pcVar7 = pcVar21;
  pcVar22 = __needle;
  if (pcVar26 == (char *)0xb8) {
    lVar6 = 8;
    do {
      apcStack_2688[0] = (code *)0x13139e;
      bson_destroy(*(undefined8 *)((long)apcStack_25b0 + lVar6));
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0xb8);
    apcStack_2688[0] = (code *)0x1313b8;
    bson_destroy(uStack_25f8);
    apcStack_2688[0] = (code *)0x1313c5;
    bson_destroy(uStack_2600);
    apcStack_2688[0] = (code *)0x1313cf;
    bson_destroy(uStack_2608);
    apcStack_2688[0] = (code *)0x1313d9;
    bson_destroy(uStack_2610);
    apcStack_2688[0] = (code *)0x1313e3;
    bson_destroy(uStack_2620);
    apcStack_2688[0] = (code *)0x1313ed;
    bson_destroy(uStack_2618);
    return;
  }
  goto LAB_001312eb;
  while( true ) {
    if (pcStack_2628[uVar23] != __needle[uVar23]) {
      uVar19 = uVar23 & 0xffffffff;
      break;
    }
    uVar23 = uVar23 + 1;
    if (uStack_24fc == (uint)uVar23) break;
LAB_00131448:
    if (*(int *)(lVar6 + 4) == (int)uVar23) break;
  }
LAB_00131463:
  if ((int)uVar19 == -1) {
    uVar3 = uStack_24fc;
    if (uStack_24fc < *(uint *)(lVar6 + 4)) {
      uVar3 = *(uint *)(lVar6 + 4);
    }
    uVar19 = (ulong)(uVar3 - 1);
  }
  apcStack_2688[0] = (code *)0x131494;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar19,pcVar21,uVar5);
  apcStack_2688[0] = (code *)0x1314ac;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  pcVar7 = (char *)(ulong)uVar3;
  apcStack_2688[0] = (code *)0x1314c6;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  pcStack_2628 = (char *)CONCAT44(pcStack_2628._4_4_,uVar3);
  if (uVar3 == 0xffffffff) {
LAB_00131515:
    apcStack_2688[0] = (code *)0x13151a;
    test_bson_json_code_cold_6();
LAB_0013151a:
    apcStack_2688[0] = (code *)0x13151f;
    test_bson_json_code_cold_5();
  }
  else {
    pcVar21 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013151a;
    pcVar7 = (char *)(ulong)uStack_24fc;
    apcStack_2688[0] = (code *)0x1314ed;
    pcVar26 = (char *)write(uVar3,pcVar22,(size_t)pcVar7);
    if (pcVar26 == pcVar7) {
      pcVar7 = (char *)(ulong)*(uint *)(lVar6 + 4);
      apcStack_2688[0] = (code *)0x131504;
      pcVar26 = (char *)write(uVar4,__needle,(size_t)pcVar7);
      if (pcVar26 != pcVar7) goto LAB_00131524;
      apcStack_2688[0] = (code *)0x131515;
      test_bson_json_code_cold_4();
      goto LAB_00131515;
    }
  }
  apcStack_2688[0] = (code *)0x131524;
  test_bson_json_code_cold_2();
LAB_00131524:
  apcStack_2688[0] = (code *)0x131529;
  test_bson_json_code_cold_3();
LAB_00131529:
  apcStack_2688[0] = test_bson_json_code_errors;
  test_bson_json_code_cold_1();
  lVar28 = 8;
  pcStack_26b0 = pcVar7;
  pcStack_26a8 = __needle;
  pcStack_26a0 = pcVar22;
  pcStack_2698 = pcVar21;
  pcStack_2690 = (char *)lVar6;
  apcStack_2688[0] = (code *)&pcStack_2188;
  do {
    pcStack_2a08 = (code *)0x13157d;
    cVar1 = bson_init_from_json(auStack_2800,*(undefined8 *)(&UNK_00161268 + lVar28),
                                0xffffffffffffffff,&iStack_2a00);
    if (cVar1 != '\0') {
      pcStack_2a08 = (code *)0x1315ca;
      test_bson_json_code_errors_cold_3();
LAB_001315ca:
      pcStack_2a08 = (code *)0x1315cf;
      test_bson_json_code_errors_cold_2();
LAB_001315cf:
      pcStack_2a08 = (code *)0x1315ef;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_29f8,
              __needle);
      pcStack_2a08 = (code *)0x1315f4;
      abort();
    }
    if (iStack_2a00 != 1) {
      pcStack_2a08 = test_bson_json_dbref;
      test_bson_json_code_errors_cold_1();
      ppuStack_2a30 = &PTR_anon_var_dwarf_1ab4d_00161270;
      apcStack_2e08[0] = (code *)0x131616;
      pcStack_2a28 = __needle;
      lStack_2a20 = lVar28;
      puStack_2a18 = auStack_2800;
      puStack_2a10 = (undefined1 *)&iStack_2a00;
      pcStack_2a08 = (code *)apcStack_2688;
      uVar5 = bson_bcon_magic();
      if (oid_zero_initialized == '\0') {
        apcStack_2e08[0] = (code *)0x131635;
        bson_oid_init_from_string(oid_zero_oid,"000000000000000000000000");
        oid_zero_initialized = '\x01';
      }
      pvVar10 = (void *)0x0;
      pcVar22 = "$ref";
      pcStack_2e10 = (char *)0x0;
      pcStack_2e18 = "}";
      pcStack_2e20 = oid_zero_oid;
      pcStack_2e28 = (char *)0x6;
      pcStack_2e38 = "$id";
      pcStack_2e40 = "collection";
      pcStack_2e48 = (char *)0x131696;
      pcStack_2e30 = (char *)uVar5;
      pvStack_2dd0 = (void *)bcon_new(0,"key","{","$ref",uVar5,0);
      pcStack_2e10 = (char *)0x0;
      pcStack_2e18 = "}";
      pcStack_2e20 = (char *)0x1;
      pcStack_2e28 = (char *)0xf;
      pcStack_2e38 = "$id";
      pcStack_2e40 = "collection";
      pcStack_2e48 = (char *)0x1316e6;
      pcStack_2e30 = (char *)uVar5;
      uStack_2dc8 = bcon_new(0,"key","{","$ref",uVar5,0);
      apcStack_2e08[0] = (code *)0x0;
      pcStack_2e10 = "}";
      pcStack_2e18 = "}";
      pcStack_2e20 = (char *)0x1;
      pcStack_2e28 = (char *)0xf;
      pcStack_2e38 = "a";
      pcStack_2e40 = "{";
      pcStack_2e48 = "$id";
      pcStack_2e50 = "collection";
      pcStack_2e58 = (char *)0x13173e;
      pcStack_2e30 = (char *)uVar5;
      pvVar9 = (void *)bcon_new(0,"key","{","$ref",uVar5,0);
      pcStack_2e10 = (char *)0x0;
      pcStack_2e18 = "}";
      pcStack_2e20 = (char *)0x1;
      pcStack_2e28 = (char *)0x7;
      pcStack_2e38 = "meta";
      pcStack_2e40 = (char *)0x1;
      pcStack_2e48 = (char *)0xf;
      pcStack_2e58 = "$id";
      pcStack_2e60 = "collection";
      uStack_2e68 = 0x1317a1;
      pcStack_2e50 = (char *)uVar5;
      pcStack_2e30 = (char *)uVar5;
      uStack_2d88 = bcon_new(0,"key","{","$ref",uVar5,0);
      pcStack_2dc0 = 
      "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"$oid\": \"000000000000000000000000\"}}}";
      pvStack_2db8 = pvStack_2dd0;
      pcStack_2db0 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1}}";
      uStack_2da8 = uStack_2dc8;
      pcStack_2da0 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"a\": 1}}}";
      pvStack_2d98 = pvVar9;
      pcStack_2d90 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1,\"meta\": true}}";
      pcVar21 = "key";
      break;
    }
    if (iStack_29fc != 2) goto LAB_001315ca;
    __needle = *(char **)((long)&PTR_anon_var_dwarf_1ab4d_00161270 + lVar28);
    pcStack_2a08 = (code *)0x1315a4;
    pcVar21 = strstr(acStack_29f8,__needle);
    if (pcVar21 == (char *)0x0) goto LAB_001315cf;
    lVar28 = lVar28 + 0x10;
    if (lVar28 == 0x98) {
      return;
    }
  } while( true );
LAB_001317fb:
  apcStack_2e08[0] = (code *)0x131817;
  cVar1 = bson_init_from_json(acStack_2d80,*(undefined8 *)((long)&pcStack_2dc0 + (long)pvVar10),
                              0xffffffffffffffff,auStack_2cb8);
  pcVar7 = acStack_2d80;
  pvVar11 = pvVar10;
  if (cVar1 == '\0') goto LAB_001319dd;
  apcStack_2e08[0] = (code *)0x13182a;
  pvStack_2dd0 = (void *)bson_get_data(acStack_2d80);
  pcVar7 = *(char **)((long)&pvStack_2db8 + (long)pvVar10);
  apcStack_2e08[0] = (code *)0x13183c;
  pvVar11 = (void *)bson_get_data(pcVar7);
  if (*(uint *)(pcVar7 + 4) != uStack_2d7c) {
LAB_001318b1:
    apcStack_2e08[0] = (code *)0x1318c3;
    pcVar22 = (char *)bson_as_canonical_extended_json(acStack_2d80);
    apcStack_2e08[0] = (code *)0x1318d0;
    uVar5 = bson_as_canonical_extended_json(pcVar7);
    pvVar9 = pvStack_2dd0;
    uVar19 = 0xffffffff;
    if (uStack_2d7c == 0) goto LAB_00131915;
    uVar23 = 0;
    goto LAB_001318fb;
  }
  apcStack_2e08[0] = (code *)0x131853;
  pcVar22 = (char *)bson_get_data(pcVar7);
  apcStack_2e08[0] = (code *)0x13185e;
  pvVar9 = (void *)bson_get_data(acStack_2d80);
  apcStack_2e08[0] = (code *)0x13186c;
  iVar2 = bcmp(pcVar22,pvVar9,(ulong)*(uint *)(pcVar7 + 4));
  if (iVar2 != 0) goto LAB_001318b1;
  apcStack_2e08[0] = (code *)0x13187b;
  bson_destroy(acStack_2d80);
  pvVar10 = (void *)((long)pvVar10 + 0x10);
  pcVar21 = acStack_2d80;
  pvVar9 = pvVar11;
  if (pvVar10 == (void *)0x40) {
    lVar6 = 8;
    do {
      apcStack_2e08[0] = (code *)0x131898;
      bson_destroy(*(undefined8 *)((long)&pcStack_2dc0 + lVar6));
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x48);
    return;
  }
  goto LAB_001317fb;
  while( true ) {
    if (*(char *)((long)pvStack_2dd0 + uVar23) != *(char *)((long)pvVar11 + uVar23)) {
      uVar19 = uVar23 & 0xffffffff;
      break;
    }
    uVar23 = uVar23 + 1;
    if (uStack_2d7c == (uint)uVar23) break;
LAB_001318fb:
    if (*(int *)(pcVar7 + 4) == (int)uVar23) break;
  }
LAB_00131915:
  if ((int)uVar19 == -1) {
    uVar3 = uStack_2d7c;
    if (uStack_2d7c < *(uint *)(pcVar7 + 4)) {
      uVar3 = *(uint *)(pcVar7 + 4);
    }
    uVar19 = (ulong)(uVar3 - 1);
  }
  apcStack_2e08[0] = (code *)0x131945;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar19,pcVar22,uVar5);
  apcStack_2e08[0] = (code *)0x13195d;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  pcVar21 = (char *)(ulong)uVar3;
  apcStack_2e08[0] = (code *)0x131978;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  pvStack_2dd0 = (void *)CONCAT44(pvStack_2dd0._4_4_,uVar3);
  if (uVar3 == 0xffffffff) {
LAB_001319c9:
    apcStack_2e08[0] = (code *)0x1319ce;
    test_bson_json_dbref_cold_6();
LAB_001319ce:
    apcStack_2e08[0] = (code *)0x1319d3;
    test_bson_json_dbref_cold_5();
LAB_001319d3:
    apcStack_2e08[0] = (code *)0x1319d8;
    test_bson_json_dbref_cold_2();
  }
  else {
    pcVar22 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_001319ce;
    pcVar21 = (char *)(ulong)uStack_2d7c;
    apcStack_2e08[0] = (code *)0x1319a2;
    pcVar26 = (char *)write(uVar3,pvVar9,(size_t)pcVar21);
    if (pcVar26 != pcVar21) goto LAB_001319d3;
    pcVar7 = (char *)(ulong)*(uint *)(pcVar7 + 4);
    apcStack_2e08[0] = (code *)0x1319b8;
    pcVar26 = (char *)write(uVar4,pvVar11,(size_t)pcVar7);
    if (pcVar26 == pcVar7) {
      apcStack_2e08[0] = (code *)0x1319c9;
      test_bson_json_dbref_cold_4();
      goto LAB_001319c9;
    }
  }
  apcStack_2e08[0] = (code *)0x1319dd;
  test_bson_json_dbref_cold_3();
LAB_001319dd:
  apcStack_2e08[0] = test_bson_json_uescape;
  test_bson_json_dbref_cold_1();
  apcStack_3208[0] = (code *)0x131a07;
  pcStack_2e30 = pcVar7;
  pcStack_2e28 = pcVar21;
  pcStack_2e20 = pcVar22;
  pcStack_2e18 = (char *)pvVar11;
  pcStack_2e10 = (char *)pvVar9;
  apcStack_2e08[0] = (code *)&pcStack_2a08;
  uVar5 = bson_bcon_magic();
  apcStack_3208[0] = (code *)0x131a29;
  pvStack_31f8 = (void *)bcon_new(0,"euro",uVar5,0,anon_var_dwarf_49b7 + 0xc,0);
  apcStack_3208[0] = (code *)0x131a4d;
  pvVar9 = (void *)bcon_new(0,"crlf",uVar5,0,"\r\n",0);
  apcStack_3208[0] = (code *)0x131a6f;
  __n = (undefined1 *)bcon_new(0,"quote",uVar5,0,"\"",0);
  apcStack_3208[0] = (code *)0x131a91;
  __s1 = (undefined1 *)bcon_new(0,"backslash",uVar5,0,"\\",0);
  apcStack_3208[0] = (code *)0x131aaf;
  uVar8 = bcon_new(0,"",uVar5,0,"",0);
  apcStack_3208[0] = (code *)0x131ad1;
  uVar5 = bcon_new(0,"escapes",uVar5,0,"\f\b\t",0);
  apcStack_3208[0] = (code *)0x131ad9;
  uStack_3188 = bson_new();
  pcStack_31f0 = "{ \"euro\": \"\\u20AC\"}";
  pvStack_31e8 = pvStack_31f8;
  pcStack_31e0 = "{ \"crlf\": \"\\r\\n\"}";
  pcStack_31d0 = "{ \"quote\": \"\\\"\"}";
  pcStack_31c0 = "{ \"backslash\": \"\\\\\"}";
  pcStack_31b0 = "{ \"\": \"\"}";
  pcStack_31a0 = "{ \"escapes\": \"\\f\\b\\t\"}";
  pcStack_3190 = "{ \"nil\": \"\\u0000\"}";
  apcStack_3208[0] = (code *)0x131b76;
  pvStack_31d8 = pvVar9;
  puStack_31c8 = __n;
  puStack_31b8 = __s1;
  uStack_31a8 = uVar8;
  uStack_3198 = uVar5;
  bson_append_utf8(uStack_3188,"nil",0xffffffff,"",1);
  pvVar10 = (void *)0x8;
  while( true ) {
    apcStack_3208[0] = (code *)0x131ba0;
    cVar1 = bson_init_from_json(auStack_3180,*(undefined8 *)((long)&pvStack_31f8 + (long)pvVar10),
                                0xffffffffffffffff,auStack_30b8);
    puVar13 = auStack_3180;
    pvVar11 = pvVar10;
    if (cVar1 == '\0') break;
    apcStack_3208[0] = (code *)0x131bb3;
    pvStack_31f8 = (void *)bson_get_data(auStack_3180);
    puVar13 = *(undefined1 **)((long)&pcStack_31f0 + (long)pvVar10);
    apcStack_3208[0] = (code *)0x131bc5;
    pvVar11 = (void *)bson_get_data(puVar13);
    if (*(uint *)(puVar13 + 4) != uStack_317c) {
LAB_00131c3a:
      apcStack_3208[0] = (code *)0x131c4c;
      __s1 = (undefined1 *)bson_as_canonical_extended_json(auStack_3180);
      apcStack_3208[0] = (code *)0x131c59;
      uVar5 = bson_as_canonical_extended_json(puVar13);
      pvVar9 = pvStack_31f8;
      uVar19 = 0xffffffff;
      if (uStack_317c == 0) goto LAB_00131c9e;
      uVar23 = 0;
      goto LAB_00131c84;
    }
    apcStack_3208[0] = (code *)0x131bdc;
    __s1 = (undefined1 *)bson_get_data(puVar13);
    apcStack_3208[0] = (code *)0x131be7;
    pvVar9 = (void *)bson_get_data(auStack_3180);
    apcStack_3208[0] = (code *)0x131bf5;
    iVar2 = bcmp(__s1,pvVar9,(ulong)*(uint *)(puVar13 + 4));
    if (iVar2 != 0) goto LAB_00131c3a;
    apcStack_3208[0] = (code *)0x131c04;
    bson_destroy(auStack_3180);
    pvVar10 = (void *)((long)pvVar10 + 0x10);
    __n = auStack_3180;
    pvVar9 = pvVar11;
    if (pvVar10 == (void *)0x78) {
      lVar6 = 8;
      do {
        apcStack_3208[0] = (code *)0x131c21;
        bson_destroy(*(undefined8 *)((long)&pcStack_31f0 + lVar6));
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x78);
      return;
    }
  }
  goto LAB_00131d66;
  while( true ) {
    if (*(char *)((long)pvStack_31f8 + uVar23) != *(char *)((long)pvVar11 + uVar23)) {
      uVar19 = uVar23 & 0xffffffff;
      break;
    }
    uVar23 = uVar23 + 1;
    if (uStack_317c == (uint)uVar23) break;
LAB_00131c84:
    if (*(int *)(puVar13 + 4) == (int)uVar23) break;
  }
LAB_00131c9e:
  if ((int)uVar19 == -1) {
    uVar3 = uStack_317c;
    if (uStack_317c < *(uint *)(puVar13 + 4)) {
      uVar3 = *(uint *)(puVar13 + 4);
    }
    uVar19 = (ulong)(uVar3 - 1);
  }
  apcStack_3208[0] = (code *)0x131cce;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar19,__s1,uVar5);
  apcStack_3208[0] = (code *)0x131ce6;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  __n = (undefined1 *)(ulong)uVar3;
  apcStack_3208[0] = (code *)0x131d01;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  pvStack_31f8 = (void *)CONCAT44(pvStack_31f8._4_4_,uVar3);
  if (uVar3 == 0xffffffff) {
LAB_00131d52:
    apcStack_3208[0] = (code *)0x131d57;
    test_bson_json_uescape_cold_6();
LAB_00131d57:
    apcStack_3208[0] = (code *)0x131d5c;
    test_bson_json_uescape_cold_5();
LAB_00131d5c:
    apcStack_3208[0] = (code *)0x131d61;
    test_bson_json_uescape_cold_2();
  }
  else {
    __s1 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00131d57;
    __n = (undefined1 *)(ulong)uStack_317c;
    apcStack_3208[0] = (code *)0x131d2b;
    puVar12 = (undefined1 *)write(uVar3,pvVar9,(size_t)__n);
    if (puVar12 != __n) goto LAB_00131d5c;
    puVar13 = (undefined1 *)(ulong)*(uint *)(puVar13 + 4);
    apcStack_3208[0] = (code *)0x131d41;
    puVar12 = (undefined1 *)write(uVar4,pvVar11,(size_t)puVar13);
    if (puVar12 == puVar13) {
      apcStack_3208[0] = (code *)0x131d52;
      test_bson_json_uescape_cold_4();
      goto LAB_00131d52;
    }
  }
  apcStack_3208[0] = (code *)0x131d66;
  test_bson_json_uescape_cold_3();
LAB_00131d66:
  apcStack_3208[0] = test_bson_json_uescape_key;
  test_bson_json_uescape_cold_1();
  apcStack_3608[0] = (code *)0x131d90;
  puStack_3230 = puVar13;
  puStack_3228 = __n;
  puStack_3220 = __s1;
  pvStack_3218 = pvVar11;
  pvStack_3210 = pvVar9;
  apcStack_3208[0] = (code *)apcStack_2e08;
  uVar5 = bson_bcon_magic();
  apcStack_3608[0] = (code *)0x131daf;
  pcVar21 = (char *)bcon_new(0,anon_var_dwarf_49b7 + 0xc,uVar5,0,"euro",0);
  apcStack_3608[0] = (code *)0x131dd5;
  cVar1 = bson_init_from_json(auStack_3580,"{ \"\\u20AC\": \"euro\"}",0xffffffffffffffff,
                              auStack_34b8);
  if (cVar1 == '\0') {
LAB_00131f51:
    apcStack_3608[0] = (code *)0x131f56;
    test_bson_json_uescape_key_cold_1();
LAB_00131f56:
    apcStack_3608[0] = (code *)0x131f5b;
    test_bson_json_uescape_key_cold_6();
LAB_00131f5b:
    apcStack_3608[0] = (code *)0x131f60;
    test_bson_json_uescape_key_cold_5();
LAB_00131f60:
    apcStack_3608[0] = (code *)0x131f65;
    test_bson_json_uescape_key_cold_2();
  }
  else {
    apcStack_3608[0] = (code *)0x131ded;
    pvVar9 = (void *)bson_get_data(auStack_3580);
    apcStack_3608[0] = (code *)0x131df8;
    pvVar11 = (void *)bson_get_data(pcVar21);
    if (*(uint *)(pcVar21 + 4) == uStack_357c) {
      apcStack_3608[0] = (code *)0x131e0d;
      pvVar10 = (void *)bson_get_data(pcVar21);
      apcStack_3608[0] = (code *)0x131e1d;
      __s2 = (void *)bson_get_data(auStack_3580);
      apcStack_3608[0] = (code *)0x131e2b;
      iVar2 = bcmp(pvVar10,__s2,(ulong)*(uint *)(pcVar21 + 4));
      if (iVar2 == 0) {
        apcStack_3608[0] = (code *)0x131e3c;
        bson_destroy(auStack_3580);
        apcStack_3608[0] = (code *)0x131e44;
        bson_destroy(pcVar21);
        return;
      }
    }
    __s1 = auStack_3580;
    apcStack_3608[0] = (code *)0x131e65;
    uVar5 = bson_as_canonical_extended_json(__s1);
    apcStack_3608[0] = (code *)0x131e72;
    uVar8 = bson_as_canonical_extended_json(pcVar21);
    uVar19 = 0xffffffff;
    if (uStack_357c != 0) {
      uVar23 = 0;
      do {
        if (*(int *)(pcVar21 + 4) == (int)uVar23) break;
        if (*(char *)((long)pvVar9 + uVar23) != *(char *)((long)pvVar11 + uVar23)) {
          uVar19 = uVar23 & 0xffffffff;
          break;
        }
        uVar23 = uVar23 + 1;
      } while (uStack_357c != (uint)uVar23);
    }
    if ((int)uVar19 == -1) {
      uVar3 = uStack_357c;
      if (uStack_357c < *(uint *)(pcVar21 + 4)) {
        uVar3 = *(uint *)(pcVar21 + 4);
      }
      uVar19 = (ulong)(uVar3 - 1);
    }
    apcStack_3608[0] = (code *)0x131ecd;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar19,uVar5,uVar8);
    apcStack_3608[0] = (code *)0x131ee5;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    __n = (undefined1 *)(ulong)uVar3;
    apcStack_3608[0] = (code *)0x131f00;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_3584 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_00131f56;
    __s1 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00131f5b;
    __n = (undefined1 *)(ulong)uStack_357c;
    apcStack_3608[0] = (code *)0x131f2a;
    puVar13 = (undefined1 *)write(uVar3,pvVar9,(size_t)__n);
    if (puVar13 != __n) goto LAB_00131f60;
    pcVar21 = (char *)(ulong)*(uint *)(pcVar21 + 4);
    apcStack_3608[0] = (code *)0x131f40;
    pcVar22 = (char *)write(uVar4,pvVar11,(size_t)pcVar21);
    if (pcVar22 == pcVar21) {
      apcStack_3608[0] = (code *)0x131f51;
      test_bson_json_uescape_key_cold_4();
      goto LAB_00131f51;
    }
  }
  apcStack_3608[0] = test_bson_json_uescape_bad;
  test_bson_json_uescape_key_cold_3();
  pcStack_3988 = (code *)0x131f98;
  pcStack_3610 = pcVar21;
  apcStack_3608[0] = (code *)apcStack_3208;
  cVar1 = bson_init_from_json(auStack_3980,"{ \"bad\": \"\\u1\"}",0xffffffffffffffff,&iStack_3898);
  if (cVar1 == '\0') {
    if (iStack_3898 != 1) goto LAB_00131fe4;
    if (iStack_3894 != 1) goto LAB_00131fe9;
    pcVar21 = acStack_3890;
    pcStack_3988 = (code *)0x131fcb;
    pcVar22 = strstr(pcVar21,"UESCAPE_TOOSHORT");
    if (pcVar22 != (char *)0x0) {
      pcStack_3988 = (code *)0x131fd8;
      bson_destroy(auStack_3980);
      return;
    }
  }
  else {
    pcStack_3988 = (code *)0x131fe4;
    test_bson_json_uescape_bad_cold_4();
LAB_00131fe4:
    pcStack_3988 = (code *)0x131fe9;
    test_bson_json_uescape_bad_cold_1();
LAB_00131fe9:
    pcStack_3988 = (code *)0x131fee;
    test_bson_json_uescape_bad_cold_2();
  }
  pcStack_3988 = test_bson_json_int32;
  test_bson_json_uescape_bad_cold_3();
  pcStack_3d88 = (code *)0x132029;
  pcStack_3990 = pcVar21;
  pcStack_3988 = (code *)apcStack_3608;
  cVar1 = bson_init_from_json(acStack_3d00,"{ \"x\": 2147483647 }",0xffffffffffffffff,auStack_3c18);
  if (cVar1 == '\0') {
LAB_0013221b:
    pcStack_3d88 = (code *)0x132228;
    test_bson_json_int32_cold_1();
LAB_00132228:
    pcStack_3d88 = (code *)0x132230;
    test_bson_json_int32_cold_4();
LAB_00132230:
    pcStack_3d88 = (code *)0x13223d;
    test_bson_json_int32_cold_5();
  }
  else {
    pcStack_3d88 = (code *)0x132048;
    cVar1 = bson_iter_init_find(auStack_3d80,acStack_3d00,"x");
    if (cVar1 == '\0') {
      pcStack_3d88 = (code *)0x1321f8;
      test_bson_json_int32_cold_2();
LAB_001321f8:
      pcStack_3d88 = (code *)0x1321fd;
      test_bson_json_int32_cold_3();
LAB_001321fd:
      pcStack_3d88 = (code *)0x132202;
      test_bson_json_int32_cold_6();
LAB_00132202:
      pcStack_3d88 = (code *)0x132207;
      test_bson_json_int32_cold_7();
      pcStack_3d88 = (code *)0x13220c;
      test_bson_json_int32_cold_10();
      pcStack_3d88 = (code *)0x132211;
      test_bson_json_int32_cold_11();
      pcStack_3d88 = (code *)0x132216;
      test_bson_json_int32_cold_14();
      pcStack_3d88 = (code *)0x13221b;
      test_bson_json_int32_cold_15();
      goto LAB_0013221b;
    }
    pcStack_3d88 = (code *)0x132058;
    iVar2 = bson_iter_type(auStack_3d80);
    if (iVar2 != 0x10) goto LAB_001321f8;
    pcStack_3d88 = (code *)0x132069;
    iVar2 = bson_iter_int32(auStack_3d80);
    if (iVar2 != 0x7fffffff) goto LAB_00132228;
    pcVar21 = acStack_3d00;
    pcStack_3d88 = (code *)0x132084;
    bson_destroy(pcVar21);
    pcStack_3d88 = (code *)0x1320a2;
    cVar1 = bson_init_from_json(pcVar21,"{ \"x\": -2147483648 }",0xffffffffffffffff,auStack_3c18);
    if (cVar1 == '\0') goto LAB_00132230;
    pcStack_3d88 = (code *)0x1320c1;
    cVar1 = bson_iter_init_find(auStack_3d80,acStack_3d00,"x");
    if (cVar1 == '\0') goto LAB_001321fd;
    pcStack_3d88 = (code *)0x1320d1;
    iVar2 = bson_iter_type(auStack_3d80);
    if (iVar2 != 0x10) goto LAB_00132202;
    pcStack_3d88 = (code *)0x1320e2;
    bson_iter_int32(auStack_3d80);
  }
  pcStack_3d88 = (code *)0x132245;
  test_bson_json_int32_cold_8();
  pcStack_3d88 = (code *)0x132252;
  test_bson_json_int32_cold_9();
  pcStack_3d88 = (code *)0x13225a;
  test_bson_json_int32_cold_12();
  pcStack_3d88 = (code *)0x132267;
  test_bson_json_int32_cold_13();
  pcStack_3d88 = test_bson_json_int64;
  test_bson_json_int32_cold_16();
  pcStack_4188 = (code *)0x1322a4;
  pcStack_3d98 = pcVar21;
  pvStack_3d90 = pvVar11;
  pcStack_3d88 = (code *)&pcStack_3988;
  cVar1 = bson_init_from_json(acStack_4100,"{ \"x\": 9223372036854775807 }",0xffffffffffffffff,
                              &iStack_4020);
  if (cVar1 == '\0') {
LAB_0013253d:
    pcStack_4188 = (code *)0x13254a;
    test_bson_json_int64_cold_1();
LAB_0013254a:
    pcStack_4188 = (code *)0x132552;
    test_bson_json_int64_cold_4();
LAB_00132552:
    pcStack_4188 = (code *)0x13255f;
    test_bson_json_int64_cold_5();
LAB_0013255f:
    pcStack_4188 = (code *)0x132567;
    test_bson_json_int64_cold_8();
LAB_00132567:
    pcStack_4188 = (code *)0x13256c;
    test_bson_json_int64_cold_9();
LAB_0013256c:
    pcStack_4188 = (code *)0x132571;
    test_bson_json_int64_cold_10();
LAB_00132571:
    pcStack_4188 = (code *)0x132579;
    test_bson_json_int64_cold_23();
LAB_00132579:
    pcStack_4188 = (code *)0x13257e;
    test_bson_json_int64_cold_11();
LAB_0013257e:
    pcStack_4188 = (code *)0x132583;
    test_bson_json_int64_cold_12();
LAB_00132583:
    pcStack_4188 = (code *)0x13258b;
    test_bson_json_int64_cold_21();
LAB_0013258b:
    pcStack_4188 = (code *)0x132590;
    test_bson_json_int64_cold_13();
LAB_00132590:
    pcStack_4188 = (code *)0x132595;
    test_bson_json_int64_cold_14();
LAB_00132595:
    pcStack_4188 = (code *)0x13259d;
    test_bson_json_int64_cold_19();
LAB_0013259d:
    pcStack_4188 = (code *)0x1325a2;
    test_bson_json_int64_cold_15();
LAB_001325a2:
    pcStack_4188 = (code *)0x1325a7;
    test_bson_json_int64_cold_16();
  }
  else {
    pcStack_4188 = (code *)0x1322c3;
    cVar1 = bson_iter_init_find(auStack_4180,acStack_4100,"x");
    if (cVar1 == '\0') {
      pcStack_4188 = (code *)0x13251a;
      test_bson_json_int64_cold_2();
LAB_0013251a:
      pcStack_4188 = (code *)0x13251f;
      test_bson_json_int64_cold_3();
LAB_0013251f:
      pcStack_4188 = (code *)0x132524;
      test_bson_json_int64_cold_6();
LAB_00132524:
      pcStack_4188 = (code *)0x132529;
      test_bson_json_int64_cold_7();
LAB_00132529:
      pcStack_4188 = (code *)0x13252e;
      test_bson_json_int64_cold_24();
LAB_0013252e:
      pcStack_4188 = (code *)0x132533;
      test_bson_json_int64_cold_22();
LAB_00132533:
      pcStack_4188 = (code *)0x132538;
      test_bson_json_int64_cold_20();
LAB_00132538:
      pcStack_4188 = (code *)0x13253d;
      test_bson_json_int64_cold_18();
      goto LAB_0013253d;
    }
    pcStack_4188 = (code *)0x1322d3;
    iVar2 = bson_iter_type(auStack_4180);
    if (iVar2 != 0x12) goto LAB_0013251a;
    pvVar11 = (void *)0x7fffffffffffffff;
    pcStack_4188 = (code *)0x1322ee;
    lVar6 = bson_iter_int64(auStack_4180);
    if (lVar6 != 0x7fffffffffffffff) goto LAB_0013254a;
    pcVar21 = acStack_4100;
    pcStack_4188 = (code *)0x132307;
    bson_destroy(pcVar21);
    pcStack_4188 = (code *)0x132325;
    cVar1 = bson_init_from_json(pcVar21,"{ \"x\": -9223372036854775808 }",0xffffffffffffffff,
                                &iStack_4020);
    if (cVar1 == '\0') goto LAB_00132552;
    pcStack_4188 = (code *)0x132344;
    cVar1 = bson_iter_init_find(auStack_4180,acStack_4100,"x");
    if (cVar1 == '\0') goto LAB_0013251f;
    pcStack_4188 = (code *)0x132354;
    iVar2 = bson_iter_type(auStack_4180);
    if (iVar2 != 0x12) goto LAB_00132524;
    pcStack_4188 = (code *)0x132365;
    lVar6 = bson_iter_int64(auStack_4180);
    pvVar11 = (void *)0x8000000000000000;
    if (lVar6 != -0x8000000000000000) goto LAB_0013255f;
    pcVar21 = acStack_4100;
    pcStack_4188 = (code *)0x132381;
    bson_destroy(pcVar21);
    pcStack_4188 = (code *)0x13239f;
    cVar1 = bson_init_from_json(pcVar21,"{ \"x\": 9223372036854775808 }",0xffffffffffffffff,
                                &iStack_4020);
    if (cVar1 != '\0') goto LAB_00132529;
    if (iStack_4020 != 1) goto LAB_00132567;
    if (iStack_401c != 2) goto LAB_0013256c;
    pcVar21 = acStack_4018;
    pcStack_4188 = (code *)0x1323de;
    pcVar22 = strstr(pcVar21,"Number \"9223372036854775808\" is out of range");
    if (pcVar22 == (char *)0x0) goto LAB_00132571;
    pcStack_4188 = (code *)0x13240a;
    cVar1 = bson_init_from_json(acStack_4100,"{ \"x\": -9223372036854775809 }",0xffffffffffffffff,
                                &iStack_4020);
    if (cVar1 != '\0') goto LAB_0013252e;
    if (iStack_4020 != 1) goto LAB_00132579;
    if (iStack_401c != 2) goto LAB_0013257e;
    pcStack_4188 = (code *)0x132441;
    pcVar22 = strstr(pcVar21,"Number \"-9223372036854775809\" is out of range");
    if (pcVar22 == (char *)0x0) goto LAB_00132583;
    pcStack_4188 = (code *)0x13246d;
    cVar1 = bson_init_from_json(acStack_4100,"{ \"x\": 10000000000000000000 }",0xffffffffffffffff,
                                &iStack_4020);
    if (cVar1 != '\0') goto LAB_00132533;
    if (iStack_4020 != 1) goto LAB_0013258b;
    if (iStack_401c != 2) goto LAB_00132590;
    pcStack_4188 = (code *)0x1324a4;
    pcVar22 = strstr(pcVar21,"Number \"10000000000000000000\" is out of range");
    if (pcVar22 == (char *)0x0) goto LAB_00132595;
    pcStack_4188 = (code *)0x1324d0;
    cVar1 = bson_init_from_json(acStack_4100,"{ \"x\": -10000000000000000000 }",0xffffffffffffffff,
                                &iStack_4020);
    if (cVar1 != '\0') goto LAB_00132538;
    if (iStack_4020 != 1) goto LAB_0013259d;
    if (iStack_401c != 2) goto LAB_001325a2;
    pcStack_4188 = (code *)0x132503;
    pcVar22 = strstr(pcVar21,"Number \"-10000000000000000000\" is out of range");
    if (pcVar22 != (char *)0x0) {
      return;
    }
  }
  pcStack_4188 = test_bson_json_double;
  test_bson_json_int64_cold_17();
  pcStack_4588 = (code *)0x1325e2;
  pcStack_4190 = pcVar21;
  pcStack_4188 = (code *)&pcStack_3d88;
  cVar1 = bson_init_from_json(acStack_4500,"{ \"x\": 1 }",0xffffffffffffffff,auStack_4418);
  if (cVar1 == '\0') {
LAB_00132887:
    pcStack_4588 = (code *)0x132894;
    test_bson_json_double_cold_1();
LAB_00132894:
    pcStack_4588 = (code *)0x13289c;
    test_bson_json_double_cold_4();
LAB_0013289c:
    pcStack_4588 = (code *)0x1328a9;
    test_bson_json_double_cold_5();
LAB_001328a9:
    pcStack_4588 = (code *)0x1328b1;
    test_bson_json_double_cold_8();
LAB_001328b1:
    pcStack_4588 = (code *)0x1328be;
    test_bson_json_double_cold_9();
LAB_001328be:
    pcStack_4588 = (code *)0x1328c6;
    test_bson_json_double_cold_12();
LAB_001328c6:
    pcStack_4588 = (code *)0x1328d3;
    test_bson_json_double_cold_13();
LAB_001328d3:
    pcStack_4588 = (code *)0x1328db;
    test_bson_json_double_cold_16();
LAB_001328db:
    pcStack_4588 = (code *)0x1328e8;
    test_bson_json_double_cold_17();
  }
  else {
    pcStack_4588 = (code *)0x132601;
    cVar1 = bson_iter_init_find(auStack_4580,acStack_4500,"x");
    if (cVar1 == '\0') {
      pcStack_4588 = (code *)0x132855;
      test_bson_json_double_cold_2();
LAB_00132855:
      pcStack_4588 = (code *)0x13285a;
      test_bson_json_double_cold_3();
LAB_0013285a:
      pcStack_4588 = (code *)0x13285f;
      test_bson_json_double_cold_6();
LAB_0013285f:
      pcStack_4588 = (code *)0x132864;
      test_bson_json_double_cold_7();
LAB_00132864:
      pcStack_4588 = (code *)0x132869;
      test_bson_json_double_cold_10();
LAB_00132869:
      pcStack_4588 = (code *)0x13286e;
      test_bson_json_double_cold_11();
LAB_0013286e:
      pcStack_4588 = (code *)0x132873;
      test_bson_json_double_cold_14();
LAB_00132873:
      pcStack_4588 = (code *)0x132878;
      test_bson_json_double_cold_15();
LAB_00132878:
      pcStack_4588 = (code *)0x13287d;
      test_bson_json_double_cold_18();
LAB_0013287d:
      pcStack_4588 = (code *)0x132882;
      test_bson_json_double_cold_19();
LAB_00132882:
      pcStack_4588 = (code *)0x132887;
      test_bson_json_double_cold_21();
      goto LAB_00132887;
    }
    pcStack_4588 = (code *)0x132611;
    iVar2 = bson_iter_type(auStack_4580);
    if (iVar2 != 0x10) goto LAB_00132855;
    pcStack_4588 = (code *)0x132622;
    iVar2 = bson_iter_int32(auStack_4580);
    if (iVar2 != 1) goto LAB_00132894;
    pcVar21 = acStack_4500;
    pcStack_4588 = (code *)0x13263b;
    bson_destroy(pcVar21);
    pcStack_4588 = (code *)0x132659;
    cVar1 = bson_init_from_json(pcVar21,"{ \"x\": 4294967296 }",0xffffffffffffffff,auStack_4418);
    if (cVar1 == '\0') goto LAB_0013289c;
    pcStack_4588 = (code *)0x132678;
    cVar1 = bson_iter_init_find(auStack_4580,acStack_4500,"x");
    if (cVar1 == '\0') goto LAB_0013285a;
    pcStack_4588 = (code *)0x132688;
    iVar2 = bson_iter_type(auStack_4580);
    if (iVar2 != 0x12) goto LAB_0013285f;
    pcStack_4588 = (code *)0x132699;
    lVar6 = bson_iter_int64(auStack_4580);
    if (lVar6 != 0x100000000) goto LAB_001328a9;
    pcVar21 = acStack_4500;
    pcStack_4588 = (code *)0x1326bc;
    bson_destroy(pcVar21);
    pcStack_4588 = (code *)0x1326da;
    cVar1 = bson_init_from_json(pcVar21,"{ \"x\": 1.0 }",0xffffffffffffffff,auStack_4418);
    if (cVar1 == '\0') goto LAB_001328b1;
    pcStack_4588 = (code *)0x1326f9;
    cVar1 = bson_iter_init_find(auStack_4580,acStack_4500,"x");
    if (cVar1 == '\0') goto LAB_00132864;
    pcStack_4588 = (code *)0x132709;
    iVar2 = bson_iter_type(auStack_4580);
    if (iVar2 != 1) goto LAB_00132869;
    pcStack_4588 = (code *)0x13271a;
    dVar32 = (double)bson_iter_double(auStack_4580);
    if ((dVar32 != 1.0) || (NAN(dVar32))) goto LAB_001328be;
    pcVar21 = acStack_4500;
    pcStack_4588 = (code *)0x13273e;
    bson_destroy(pcVar21);
    pcStack_4588 = (code *)0x13275c;
    cVar1 = bson_init_from_json(pcVar21,"{ \"x\": 0.0 }",0xffffffffffffffff,auStack_4418);
    if (cVar1 == '\0') goto LAB_001328c6;
    pcStack_4588 = (code *)0x13277b;
    cVar1 = bson_iter_init_find(auStack_4580,acStack_4500,"x");
    if (cVar1 == '\0') goto LAB_0013286e;
    pcStack_4588 = (code *)0x13278b;
    iVar2 = bson_iter_type(auStack_4580);
    if (iVar2 != 1) goto LAB_00132873;
    pcStack_4588 = (code *)0x13279c;
    dVar32 = (double)bson_iter_double(auStack_4580);
    if ((dVar32 != 0.0) || (NAN(dVar32))) goto LAB_001328d3;
    pcVar21 = acStack_4500;
    pcStack_4588 = (code *)0x1327c0;
    bson_destroy(pcVar21);
    pcStack_4588 = (code *)0x1327de;
    cVar1 = bson_init_from_json(pcVar21,"{ \"x\": -0.0 }",0xffffffffffffffff,auStack_4418);
    if (cVar1 == '\0') goto LAB_001328db;
    pcStack_4588 = (code *)0x1327fd;
    cVar1 = bson_iter_init_find(auStack_4580,acStack_4500,"x");
    if (cVar1 == '\0') goto LAB_00132878;
    pcStack_4588 = (code *)0x132809;
    iVar2 = bson_iter_type(auStack_4580);
    if (iVar2 != 1) goto LAB_0013287d;
    pcStack_4588 = (code *)0x132816;
    dVar32 = (double)bson_iter_double(auStack_4580);
    if ((dVar32 == 0.0) && (!NAN(dVar32))) {
      pcStack_4588 = (code *)0x132832;
      bson_iter_double(auStack_4580);
      if (extraout_XMM0_Db < 0) {
        pcStack_4588 = (code *)0x132849;
        bson_destroy(acStack_4500);
        return;
      }
      goto LAB_00132882;
    }
  }
  pcStack_4588 = test_bson_json_double_overflow;
  test_bson_json_double_cold_20();
  pcVar22 = "2e400";
  ppuVar27 = &PTR_anon_var_dwarf_1affa_00161308;
  pcStack_45b0 = pcVar21;
  puStack_45a8 = __n;
  puStack_45a0 = __s1;
  pvStack_4598 = pvVar11;
  pvStack_4590 = pvVar9;
  pcStack_4588 = (code *)&pcStack_4188;
  while( true ) {
    pcStack_4908 = (code *)0x13292e;
    uVar5 = bson_strdup_printf("{ \"d\" : %s }",pcVar22);
    pcStack_4908 = (code *)0x13294b;
    cVar1 = bson_init_from_json(auStack_4700,uVar5,0xffffffffffffffff,&iStack_4900);
    if (cVar1 != '\0') break;
    if (iStack_4900 != 1) goto LAB_00132a15;
    if (iStack_48fc != 2) goto LAB_00132a10;
    pcStack_4908 = (code *)0x132979;
    pcVar21 = strstr(acStack_48f8,"out of range");
    if (pcVar21 == (char *)0x0) goto LAB_00132a1a;
    pcStack_4908 = (code *)0x13298a;
    bson_free(uVar5);
    pcStack_4908 = (code *)0x13299b;
    uVar5 = bson_strdup_printf("{ \"d\" : { \"$numberDouble\" : \"%s\" } }",pcVar22);
    pcStack_4908 = (code *)0x1329b8;
    cVar1 = bson_init_from_json(auStack_4700,uVar5,0xffffffffffffffff,&iStack_4900);
    if (cVar1 != '\0') goto LAB_00132a0b;
    if (iStack_4900 != 1) goto LAB_00132a29;
    if (iStack_48fc != 2) goto LAB_00132a24;
    pcStack_4908 = (code *)0x1329da;
    pcVar21 = strstr(acStack_48f8,"out of range");
    if (pcVar21 == (char *)0x0) goto LAB_00132a2e;
    pcStack_4908 = (code *)0x1329e7;
    bson_free(uVar5);
    pcVar22 = *ppuVar27;
    ppuVar27 = ppuVar27 + 1;
    if (pcVar22 == (char *)0x0) {
      return;
    }
  }
  pcStack_4908 = (code *)0x132a0b;
  test_bson_json_double_overflow_cold_8();
LAB_00132a0b:
  pcStack_4908 = (code *)0x132a10;
  test_bson_json_double_overflow_cold_6();
LAB_00132a10:
  pcStack_4908 = (code *)0x132a15;
  test_bson_json_double_overflow_cold_2();
LAB_00132a15:
  pcStack_4908 = (code *)0x132a1a;
  test_bson_json_double_overflow_cold_1();
LAB_00132a1a:
  pcStack_4908 = (code *)0x132a24;
  test_bson_json_double_overflow_cold_7();
LAB_00132a24:
  pcStack_4908 = (code *)0x132a29;
  test_bson_json_double_overflow_cold_4();
LAB_00132a29:
  pcStack_4908 = (code *)0x132a2e;
  test_bson_json_double_overflow_cold_3();
LAB_00132a2e:
  pcStack_4908 = test_bson_json_nan;
  test_bson_json_double_overflow_cold_5();
  pcStack_4920 = "out of range";
  pcVar7 = "{ \"d\": NaN }";
  ppuVar25 = &PTR_anon_var_dwarf_1b04e_00161328;
  piVar20 = aiStack_4c80;
  piVar14 = &iStack_4bb8;
  piVar31 = (int *)0x14a6f6;
  pcVar21 = (char *)&dStack_4c88;
  uStack_4930 = uVar5;
  puStack_4928 = (undefined1 *)&iStack_4900;
  pcStack_4918 = pcVar22;
  ppuStack_4910 = ppuVar27;
  pcStack_4908 = (code *)&pcStack_4588;
  do {
    apcStack_4d08[0] = (code *)0x132a8c;
    cVar1 = bson_init_from_json(piVar20,pcVar7,0xffffffffffffffff,piVar14);
    if (cVar1 == '\0') {
      apcStack_4d08[0] = (code *)0x132bf5;
      test_bson_json_nan_cold_1();
LAB_00132bf5:
      apcStack_4d08[0] = (code *)0x132bfa;
      test_bson_json_nan_cold_2();
LAB_00132bfa:
      apcStack_4d08[0] = (code *)0x132bff;
      test_bson_json_nan_cold_3();
      goto LAB_00132bff;
    }
    apcStack_4d08[0] = (code *)0x132a99;
    uVar5 = bson_bcone_magic();
    apcStack_4d08[0] = (code *)0x132ab4;
    cVar1 = bcon_extract(piVar20,"d",uVar5,1,pcVar21,0);
    if (cVar1 == '\0') goto LAB_00132bf5;
    if (!NAN(dStack_4c88) && !NAN(dStack_4c88)) goto LAB_00132bfa;
    apcStack_4d08[0] = (code *)0x132ad4;
    bson_destroy(piVar20);
    pcVar7 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
  } while (pcVar7 != (char *)0x0);
  pcVar22 = "{ \"d\": NaNn }";
  ppuVar25 = &PTR_anon_var_dwarf_1b07e_00161358;
  piVar20 = aiStack_4bb0;
  piVar14 = aiStack_4c80;
  piVar31 = &iStack_4bb8;
  pcVar21 = "Got parse error at";
  do {
    apcStack_4d08[0] = (code *)0x132b20;
    cVar1 = bson_init_from_json(piVar14,pcVar22,0xffffffffffffffff,piVar31);
    if (cVar1 != '\0') goto LAB_00132bff;
    if (iStack_4bb8 != 1) goto LAB_00132c16;
    if (iStack_4bb4 != 1) goto LAB_00132c09;
    apcStack_4d08[0] = (code *)0x132b53;
    pcVar22 = strstr((char *)piVar20,"Got parse error at");
    if (pcVar22 == (char *)0x0) goto LAB_00132c0e;
    pcVar22 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
  } while (pcVar22 != (char *)0x0);
  pcVar22 = "{ \"d\": nu";
  ppuVar25 = &PTR_anon_var_dwarf_1b0c6_00161398;
  piVar20 = aiStack_4bb0;
  piVar14 = aiStack_4c80;
  piVar31 = &iStack_4bb8;
  pcVar21 = "Incomplete JSON";
  while( true ) {
    apcStack_4d08[0] = (code *)0x132ba8;
    cVar1 = bson_init_from_json(piVar14,pcVar22,0xffffffffffffffff,piVar31);
    if (cVar1 != '\0') break;
    if (iStack_4bb8 != 1) goto LAB_00132c28;
    if (iStack_4bb4 != 1) goto LAB_00132c1b;
    apcStack_4d08[0] = (code *)0x132bcf;
    pcVar22 = strstr((char *)piVar20,"Incomplete JSON");
    if (pcVar22 == (char *)0x0) goto LAB_00132c20;
    pcVar22 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
    if (pcVar22 == (char *)0x0) {
      return;
    }
  }
LAB_00132c04:
  apcStack_4d08[0] = (code *)0x132c09;
  test_bson_json_nan_cold_9();
LAB_00132c09:
  apcStack_4d08[0] = (code *)0x132c0e;
  test_bson_json_nan_cold_5();
LAB_00132c0e:
  apcStack_4d08[0] = (code *)0x132c16;
  test_bson_json_nan_cold_10();
LAB_00132c16:
  apcStack_4d08[0] = (code *)0x132c1b;
  test_bson_json_nan_cold_4();
LAB_00132c1b:
  apcStack_4d08[0] = (code *)0x132c20;
  test_bson_json_nan_cold_7();
LAB_00132c20:
  apcStack_4d08[0] = (code *)0x132c28;
  test_bson_json_nan_cold_8();
LAB_00132c28:
  apcStack_4d08[0] = test_bson_json_infinity;
  test_bson_json_nan_cold_6();
  pcVar22 = "{ \"d\": Infinity }";
  ppuVar27 = &PTR_anon_var_dwarf_1b13e_001613b8;
  piStack_4d30 = piVar20;
  pdStack_4d28 = (double *)pcVar21;
  ppuStack_4d20 = ppuVar25;
  piStack_4d18 = piVar14;
  piStack_4d10 = piVar31;
  apcStack_4d08[0] = (code *)&pcStack_4908;
  do {
    apcStack_5108[0] = (code *)0x132c81;
    cVar1 = bson_init_from_json(aiStack_5080,pcVar22,0xffffffffffffffff,&iStack_4fb8);
    if (cVar1 == '\0') {
      apcStack_5108[0] = (code *)0x132eb1;
      test_bson_json_infinity_cold_1();
LAB_00132eb1:
      apcStack_5108[0] = (code *)0x132eb6;
      test_bson_json_infinity_cold_2();
LAB_00132eb6:
      apcStack_5108[0] = (code *)0x132ebb;
      test_bson_json_infinity_cold_3();
      goto LAB_00132ebb;
    }
    apcStack_5108[0] = (code *)0x132c8e;
    uVar5 = bson_bcone_magic();
    apcStack_5108[0] = (code *)0x132ca9;
    cVar1 = bcon_extract(aiStack_5080,"d",uVar5,1,&dStack_5088,0);
    if (cVar1 == '\0') goto LAB_00132eb1;
    if ((NAN(dStack_5088)) || (!NAN(dStack_5088 - dStack_5088) && !NAN(dStack_5088 - dStack_5088)))
    goto LAB_00132eb6;
    apcStack_5108[0] = (code *)0x132cd7;
    bson_destroy(aiStack_5080);
    pcVar22 = *ppuVar27;
    ppuVar27 = ppuVar27 + 1;
  } while (pcVar22 != (char *)0x0);
  pcVar21 = "{ \"d\": -Infinity }";
  ppuVar27 = &PTR_anon_var_dwarf_1b162_001613d8;
  do {
    apcStack_5108[0] = (code *)0x132d20;
    cVar1 = bson_init_from_json(aiStack_5080,pcVar21,0xffffffffffffffff,&iStack_4fb8);
    if (cVar1 == '\0') goto LAB_00132ebb;
    apcStack_5108[0] = (code *)0x132d2d;
    uVar5 = bson_bcone_magic();
    apcStack_5108[0] = (code *)0x132d48;
    cVar1 = bcon_extract(aiStack_5080,"d",uVar5,1,&dStack_5088,0);
    if (cVar1 == '\0') goto LAB_00132ec0;
    if ((NAN(dStack_5088)) || (!NAN(dStack_5088 - dStack_5088))) goto LAB_00132ec5;
    if (0.0 <= dStack_5088) goto LAB_00132eca;
    apcStack_5108[0] = (code *)0x132d88;
    bson_destroy(aiStack_5080);
    pcVar21 = *ppuVar27;
    ppuVar27 = ppuVar27 + 1;
  } while (pcVar21 != (char *)0x0);
  pcVar22 = "{ \"d\": Infinityy }";
  ppuVar27 = &PTR_anon_var_dwarf_1b186_001613f8;
  piVar20 = aiStack_4fb0;
  piVar14 = aiStack_5080;
  piVar31 = &iStack_4fb8;
  pcVar21 = "Got parse error at";
  do {
    apcStack_5108[0] = (code *)0x132dd8;
    cVar1 = bson_init_from_json(piVar14,pcVar22,0xffffffffffffffff,piVar31);
    if (cVar1 != '\0') goto LAB_00132ecf;
    if (iStack_4fb8 != 1) goto LAB_00132ee6;
    if (iStack_4fb4 != 1) goto LAB_00132ed9;
    apcStack_5108[0] = (code *)0x132e0b;
    pcVar22 = strstr((char *)piVar20,"Got parse error at");
    if (pcVar22 == (char *)0x0) goto LAB_00132ede;
    pcVar22 = *ppuVar27;
    ppuVar27 = ppuVar27 + 1;
  } while (pcVar22 != (char *)0x0);
  pcVar22 = "{ \"d\": In";
  ppuVar27 = &PTR_anon_var_dwarf_1b1e6_00161448;
  piVar20 = aiStack_4fb0;
  piVar14 = aiStack_5080;
  piVar31 = &iStack_4fb8;
  pcVar21 = "Incomplete JSON";
  while( true ) {
    apcStack_5108[0] = (code *)0x132e60;
    cVar1 = bson_init_from_json(piVar14,pcVar22,0xffffffffffffffff,piVar31);
    if (cVar1 != '\0') break;
    if (iStack_4fb8 != 1) goto LAB_00132ef8;
    if (iStack_4fb4 != 1) goto LAB_00132eeb;
    apcStack_5108[0] = (code *)0x132e8b;
    pcVar22 = strstr((char *)piVar20,"Incomplete JSON");
    if (pcVar22 == (char *)0x0) goto LAB_00132ef0;
    pcVar22 = *ppuVar27;
    ppuVar27 = ppuVar27 + 1;
    if (pcVar22 == (char *)0x0) {
      return;
    }
  }
LAB_00132ed4:
  apcStack_5108[0] = (code *)0x132ed9;
  test_bson_json_infinity_cold_13();
LAB_00132ed9:
  apcStack_5108[0] = (code *)0x132ede;
  test_bson_json_infinity_cold_9();
LAB_00132ede:
  apcStack_5108[0] = (code *)0x132ee6;
  test_bson_json_infinity_cold_14();
LAB_00132ee6:
  apcStack_5108[0] = (code *)0x132eeb;
  test_bson_json_infinity_cold_8();
LAB_00132eeb:
  apcStack_5108[0] = (code *)0x132ef0;
  test_bson_json_infinity_cold_11();
LAB_00132ef0:
  apcStack_5108[0] = (code *)0x132ef8;
  test_bson_json_infinity_cold_12();
LAB_00132ef8:
  apcStack_5108[0] = test_bson_json_null;
  test_bson_json_infinity_cold_10();
  pcStack_5488 = (code *)0x132f2a;
  apcStack_5108[0] = (code *)apcStack_4d08;
  cVar1 = bson_init_from_json(auStack_5480,"{ \"x\": null }",0xffffffffffffffff,auStack_5390);
  if (cVar1 == '\0') {
    pcStack_5488 = (code *)0x132f65;
    test_bson_json_null_cold_1();
  }
  else {
    pcStack_5488 = (code *)0x132f33;
    uVar5 = bson_bcone_magic();
    pcStack_5488 = (code *)0x132f4f;
    cVar1 = bcon_extract(auStack_5480,"x",uVar5,9,0);
    if (cVar1 != '\0') {
      pcStack_5488 = (code *)0x132f5b;
      bson_destroy(auStack_5480);
      return;
    }
  }
  pcStack_5488 = test_bson_json_empty_final_object;
  test_bson_json_null_cold_2();
  pcStack_5888 = (code *)0x0;
  pcStack_5890 = "}";
  acStack_58a0[8] = -0x52;
  acStack_58a0[9] = '/';
  acStack_58a0[10] = '\x13';
  acStack_58a0[0xb] = '\0';
  acStack_58a0[0xc] = '\0';
  acStack_58a0[0xd] = '\0';
  acStack_58a0[0xe] = '\0';
  acStack_58a0[0xf] = '\0';
  piStack_54b0 = piVar20;
  pdStack_54a8 = (double *)pcVar21;
  ppuStack_54a0 = ppuVar27;
  piStack_5498 = piVar14;
  piStack_5490 = piVar31;
  pcStack_5488 = (code *)apcStack_5108;
  uVar19 = bcon_new(0,"a","{","b","{");
  uStack_5790 = 0;
  uStack_5788 = 0;
  uStack_57a0 = 0;
  uStack_5798 = 0;
  uStack_57b0 = 0;
  uStack_57a8 = 0;
  uStack_57c0 = 0;
  uStack_57b8 = 0;
  uStack_57d0 = 0;
  uStack_57c8 = 0;
  uStack_57e0 = 0;
  uStack_57d8 = 0;
  uStack_57f0 = 0;
  uStack_57e8 = 0;
  uStack_5800 = (undefined *)0x500000003;
  uStack_57f8 = 5;
  pcStack_5888 = (code *)0x13300b;
  cVar1 = bson_init_from_json(&uStack_5800,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,auStack_5738);
  if (cVar1 != '\0') {
    pcStack_5888 = (code *)0x133023;
    piVar31 = (int *)bson_get_data(&uStack_5800);
    pcStack_5888 = (code *)0x13302e;
    piVar14 = (int *)bson_get_data(uVar19);
    if (*(int *)(uVar19 + 4) == uStack_5800._4_4_) {
      pcStack_5888 = (code *)0x133043;
      pvVar9 = (void *)bson_get_data(uVar19);
      pcStack_5888 = (code *)0x133053;
      pvVar10 = (void *)bson_get_data(&uStack_5800);
      pcStack_5888 = (code *)0x133061;
      iVar2 = bcmp(pvVar9,pvVar10,(ulong)*(uint *)(uVar19 + 4));
      if (iVar2 == 0) {
        pcStack_5888 = (code *)0x133072;
        bson_destroy(&uStack_5800);
        pcStack_5888 = (code *)0x13307a;
        bson_destroy(uVar19);
        return;
      }
    }
    ppuVar27 = (undefined **)&uStack_5800;
    pcStack_5888 = (code *)0x13309b;
    uVar5 = bson_as_canonical_extended_json(ppuVar27);
    pcStack_5888 = (code *)0x1330a8;
    uVar8 = bson_as_canonical_extended_json(uVar19);
    uVar23 = 0xffffffff;
    if (uStack_5800._4_4_ != 0) {
      uVar24 = 0;
      do {
        if (*(int *)(uVar19 + 4) == (int)uVar24) break;
        if (*(char *)((long)piVar31 + uVar24) != *(char *)((long)piVar14 + uVar24)) {
          uVar23 = uVar24 & 0xffffffff;
          break;
        }
        uVar24 = uVar24 + 1;
      } while (uStack_5800._4_4_ != (uint)uVar24);
    }
    if ((int)uVar23 == -1) {
      uVar3 = uStack_5800._4_4_;
      if (uStack_5800._4_4_ < *(uint *)(uVar19 + 4)) {
        uVar3 = *(uint *)(uVar19 + 4);
      }
      uVar23 = (ulong)(uVar3 - 1);
    }
    pcStack_5888 = (code *)0x133103;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar23,uVar5,uVar8);
    pcStack_5888 = (code *)0x13311b;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar21 = (char *)(ulong)uVar3;
    pcStack_5888 = (code *)0x133136;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_5804 = uVar3;
    if (uVar3 == 0xffffffff) {
LAB_00133187:
      pcStack_5888 = (code *)0x13318c;
      test_bson_json_empty_final_object_cold_6();
LAB_0013318c:
      pcStack_5888 = (code *)0x133191;
      test_bson_json_empty_final_object_cold_5();
LAB_00133191:
      pcStack_5888 = (code *)0x133196;
      test_bson_json_empty_final_object_cold_2();
    }
    else {
      ppuVar27 = (undefined **)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013318c;
      pcVar21 = (char *)((ulong)uStack_5800 >> 0x20);
      pcStack_5888 = (code *)0x133160;
      pdVar15 = (double *)write(uVar3,piVar31,(size_t)pcVar21);
      if (pdVar15 != (double *)pcVar21) goto LAB_00133191;
      uVar19 = (ulong)*(uint *)(uVar19 + 4);
      pcStack_5888 = (code *)0x133176;
      uVar23 = write(uVar4,piVar14,uVar19);
      if (uVar23 == uVar19) {
        pcStack_5888 = (code *)0x133187;
        test_bson_json_empty_final_object_cold_4();
        goto LAB_00133187;
      }
    }
    pcStack_5888 = (code *)0x13319b;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_5888 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar22 = acStack_58a0;
  acStack_58a0[8] = '\0';
  acStack_58a0[9] = '\0';
  acStack_58a0[10] = '\0';
  acStack_58a0[0xb] = '\0';
  acStack_58a0[0xc] = '\0';
  acStack_58a0[0xd] = '\0';
  acStack_58a0[0xe] = '@';
  acStack_58a0[0xf] = '0';
  acStack_58a0[0] = '\v';
  acStack_58a0[1] = '\0';
  acStack_58a0[2] = '\0';
  acStack_58a0[3] = '\0';
  acStack_58a0[4] = '\0';
  acStack_58a0[5] = '\0';
  acStack_58a0[6] = '\0';
  acStack_58a0[7] = '\0';
  pcStack_58b0 = (code *)0x1331ce;
  pcStack_5890 = (char *)uVar19;
  pcStack_5888 = (code *)piVar14;
  plVar16 = (long *)bson_new();
  pcStack_58b0 = (code *)0x1331e8;
  cVar1 = bson_append_decimal128(plVar16,"decimal128",0xffffffff,pcVar22);
  if (cVar1 == '\0') {
    pcStack_58b0 = (code *)0x133236;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_58b0 = (code *)0x1331f7;
    pcVar22 = (char *)bson_as_json(plVar16,auStack_58a8);
    if (pcVar22 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00133219:
      pcStack_58b0 = (code *)0x133221;
      bson_free(pcVar22);
      pcStack_58b0 = (code *)0x133229;
      bson_destroy(plVar16);
      return;
    }
    pcStack_58b0 = (code *)0x133215;
    iVar2 = strcmp(pcVar22,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00133219;
  }
  pcStack_58b0 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar33 = &pcStack_58b0;
  pcStack_5d08 = (code *)0x133271;
  plStack_58b8 = plVar16;
  pcStack_58b0 = (code *)&pcStack_5488;
  cVar1 = bson_init_from_json(auStack_5c00,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_5b18);
  if (cVar1 == '\0') goto LAB_00133315;
  pcStack_5d08 = (code *)0x13328e;
  cVar1 = bson_iter_init(auStack_5c80,auStack_5c00);
  if (cVar1 == '\0') {
    pcStack_5d08 = (code *)0x133301;
    test_bson_json_number_decimal_cold_2();
LAB_00133301:
    pcStack_5d08 = (code *)0x133306;
    test_bson_json_number_decimal_cold_3();
LAB_00133306:
    pcStack_5d08 = (code *)0x13330b;
    test_bson_json_number_decimal_cold_4();
LAB_0013330b:
    pcStack_5d08 = (code *)0x133310;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    pcStack_5d08 = (code *)0x1332a6;
    cVar1 = bson_iter_find(auStack_5c80,"key");
    if (cVar1 == '\0') goto LAB_00133301;
    pcStack_5d08 = (code *)0x1332b7;
    iVar2 = bson_iter_type(auStack_5c80);
    if (iVar2 != 0x13) goto LAB_00133306;
    plVar16 = &lStack_5c90;
    pcStack_5d08 = (code *)0x1332d1;
    bson_iter_decimal128(auStack_5c80,plVar16);
    if (lStack_5c90 != 0xb) goto LAB_0013330b;
    if (lStack_5c88 == 0x3040000000000000) {
      pcStack_5d08 = (code *)0x1332f5;
      bson_destroy(auStack_5c00);
      return;
    }
  }
  pcStack_5d08 = (code *)0x133315;
  test_bson_json_number_decimal_cold_6();
LAB_00133315:
  pcStack_5d08 = test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar7 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar25 = &PTR_anon_var_dwarf_1b2e2_00161470;
  plStack_5d20 = plVar16;
  pdStack_5d18 = (double *)pcVar21;
  pcStack_5d10 = pcVar22;
  pcStack_5d08 = (code *)piVar31;
  do {
    pcStack_5f30 = (code *)0x133357;
    lVar6 = bson_new_from_json(pcVar7,0xffffffffffffffff,&iStack_5f20);
    if (lVar6 != 0) {
      pcStack_5f30 = (code *)0x1333a4;
      test_bson_json_errors_cold_1();
LAB_001333a4:
      pcStack_5f30 = (code *)0x1333c2;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_5f18,
              piVar31);
      pcStack_5f30 = (code *)0x1333c7;
      abort();
    }
    if (iStack_5f20 != 1) {
LAB_001333cc:
      pcStack_5f30 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_6148 = (code *)0x1333f1;
      pcStack_5f38 = acStack_5f18;
      pcStack_5f30 = (code *)&iStack_5f20;
      pcVar21 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                           auStack_6138);
      pcStack_6148 = (code *)0x1333fe;
      pcVar22 = (char *)bson_as_json(pcVar21,0);
      if (pcVar22 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_00133420:
        pcStack_6148 = (code *)0x133428;
        bson_free(pcVar22);
        pcStack_6148 = (code *)0x133430;
        bson_destroy(pcVar21);
        return;
      }
      pcStack_6148 = (code *)0x13341c;
      iVar2 = strcmp(pcVar22,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_00133420;
      pcStack_6148 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_6358 = 0x2200223a2261227b;
      uStack_6350 = 0x7d;
      uStack_635c = 0x227b;
      pcStack_6148 = (code *)pcVar21;
      lVar6 = bson_new_from_json(&uStack_6358,9,&iStack_6348);
      if (lVar6 == 0) {
        if (iStack_6348 != 1) goto LAB_001334fc;
        if (iStack_6344 != 1) goto LAB_00133501;
        pcVar21 = acStack_6340;
        pcVar7 = strstr(pcVar21,"Got parse error");
        if (pcVar7 == (char *)0x0) goto LAB_00133506;
        lVar6 = bson_new_from_json(&uStack_635c,3,&iStack_6348);
        if (lVar6 != 0) goto LAB_001334f7;
        if (iStack_6348 != 1) goto LAB_0013350e;
        if (iStack_6344 == 1) {
          pcVar7 = strstr(pcVar21,"Got parse error");
          if (pcVar7 != (char *)0x0) {
            return;
          }
          goto LAB_00133518;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_001334f7:
        test_bson_json_null_in_str_cold_4();
LAB_001334fc:
        test_bson_json_null_in_str_cold_2();
LAB_00133501:
        test_bson_json_null_in_str_cold_3();
LAB_00133506:
        test_bson_json_null_in_str_cold_8();
LAB_0013350e:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00133518:
      test_bson_json_null_in_str_cold_7();
      uVar5 = extraout_RAX;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar8 = bson_bcon_magic();
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0,uVar5,pcVar21,ppuVar25,ppuVar27,pcVar22,piVar31,ppcVar33)
      ;
      uVar17 = bcon_new(0,"b",uVar8,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar5,uVar17,0);
      uVar5 = bson_new();
      uVar17 = bson_new();
      uVar18 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar5,uVar17,uVar18,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,"b",uVar8,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar5,0);
      uVar5 = bson_new();
      _test_json_produces_multiple("[]",0,uVar5,0);
      uVar5 = bcon_new(0,"0","{","x",uVar8,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar5,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_5f1c != 2) {
      pcStack_5f30 = (code *)0x1333cc;
      test_bson_json_errors_cold_3();
      goto LAB_001333cc;
    }
    piVar31 = (int *)ppuVar25[-1];
    pcStack_5f30 = (code *)0x13337e;
    pcVar21 = strstr(acStack_5f18,(char *)piVar31);
    if (pcVar21 == (char *)0x0) goto LAB_001333a4;
    pcVar7 = *ppuVar25;
    ppuVar25 = ppuVar25 + 2;
    if (pcVar7 == (char *)0x0) {
      return;
    }
  } while( true );
LAB_00132bff:
  apcStack_4d08[0] = (code *)0x132c04;
  test_bson_json_nan_cold_11();
  goto LAB_00132c04;
LAB_00132ebb:
  apcStack_5108[0] = (code *)0x132ec0;
  test_bson_json_infinity_cold_4();
LAB_00132ec0:
  apcStack_5108[0] = (code *)0x132ec5;
  test_bson_json_infinity_cold_5();
LAB_00132ec5:
  apcStack_5108[0] = (code *)0x132eca;
  test_bson_json_infinity_cold_6();
LAB_00132eca:
  piVar14 = &iStack_4fb8;
  pcVar21 = (char *)&dStack_5088;
  piVar20 = aiStack_5080;
  piVar31 = (int *)0x14a6f6;
  apcStack_5108[0] = (code *)0x132ecf;
  test_bson_json_infinity_cold_7();
LAB_00132ecf:
  apcStack_5108[0] = (code *)0x132ed4;
  test_bson_json_infinity_cold_15();
  goto LAB_00132ed4;
}

Assistant:

static void
test_bson_json_read_dbpointer (void)
{
   bson_t b;
   bson_error_t error;
   bool r;

   /* must have both $ref and $id, $id must be ObjectId */
   const char *invalid[] = {
      "{\"p\": {\"$dbPointer\": {\"$ref\": \"db.collection\"}}",
      "$dbPointer requires both $id and $ref",

      "{\"p\": {\"$dbPointer\": {\"$ref\": \"db.collection\", \"$id\": 1}}",
      "$dbPointer.$id must be like {\"$oid\": ...\"}",

      "{\"p\": {\"$dbPointer\": {\"$id\": {"
      "\"$oid\": \"57e193d7a9cc81b4027498b1\"}}}}",
      "$dbPointer requires both $id and $ref",

      "{\"p\": {\"$dbPointer\": {}}}",
      "Empty $dbPointer",

      NULL};

   const char **p;

   for (p = invalid; *p; p += 2) {
      r = bson_init_from_json (&b, *p, -1, &error);
      BSON_ASSERT (!r);
      ASSERT_ERROR_CONTAINS (
         error, BSON_ERROR_JSON, BSON_JSON_ERROR_READ_INVALID_PARAM, *(p + 1));

      bson_destroy (&b);
   }
}